

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  uint uVar59;
  uint uVar60;
  float fVar61;
  float fVar89;
  vint4 bi_2;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar62;
  float fVar90;
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar66 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar95 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 extraout_var [56];
  vint4 ai;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float t1;
  float fVar143;
  float fVar152;
  float fVar153;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar154;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar172;
  float fVar188;
  float fVar189;
  vint4 ai_2;
  undefined1 auVar173 [16];
  float fVar190;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar191;
  float fVar204;
  float fVar205;
  undefined1 auVar192 [16];
  float fVar206;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  vfloat4 b0;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  float fVar219;
  float fVar229;
  float fVar230;
  vint4 ai_1;
  undefined1 auVar220 [16];
  float fVar231;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar240 [32];
  float fVar242;
  undefined1 auVar241 [32];
  float fVar246;
  float fVar254;
  float fVar255;
  vfloat4 a0_1;
  float fVar256;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  float fVar257;
  float fVar266;
  float fVar267;
  __m128 a;
  float fVar268;
  undefined1 auVar258 [16];
  undefined1 auVar264 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar265 [64];
  float fVar269;
  float fVar274;
  float fVar275;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar273 [64];
  float fVar281;
  float fVar285;
  float fVar286;
  undefined1 auVar282 [16];
  float fVar287;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar288;
  float fVar289;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar301;
  vfloat4 a0;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float fStack_4a0;
  undefined1 local_498 [16];
  undefined1 (*local_480) [16];
  ulong local_478;
  long local_470;
  RTCFilterFunctionNArguments local_468;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 auStack_3c8 [16];
  uint auStack_3b8 [4];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar203 [32];
  undefined1 auVar294 [32];
  
  PVar6 = prim[1];
  uVar58 = (ulong)(byte)PVar6;
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar111 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar111 = vinsertps_avx(auVar111,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar172 = *(float *)(prim + uVar58 * 0x19 + 0x12);
  auVar70 = vsubps_avx(auVar70,*(undefined1 (*) [16])(prim + uVar58 * 0x19 + 6));
  auVar116._0_4_ = fVar172 * auVar70._0_4_;
  auVar116._4_4_ = fVar172 * auVar70._4_4_;
  auVar116._8_4_ = fVar172 * auVar70._8_4_;
  auVar116._12_4_ = fVar172 * auVar70._12_4_;
  auVar207._0_4_ = fVar172 * auVar111._0_4_;
  auVar207._4_4_ = fVar172 * auVar111._4_4_;
  auVar207._8_4_ = fVar172 * auVar111._8_4_;
  auVar207._12_4_ = fVar172 * auVar111._12_4_;
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar58 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  uVar56 = (ulong)(uint)((int)(uVar58 * 9) * 2);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + uVar58 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar56 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar63 = vshufps_avx(auVar207,auVar207,0);
  auVar91 = vshufps_avx(auVar207,auVar207,0x55);
  auVar117 = vshufps_avx(auVar207,auVar207,0xaa);
  fVar172 = auVar117._0_4_;
  fVar143 = auVar117._4_4_;
  fVar188 = auVar117._8_4_;
  fVar152 = auVar117._12_4_;
  fVar191 = auVar91._0_4_;
  fVar204 = auVar91._4_4_;
  fVar205 = auVar91._8_4_;
  fVar206 = auVar91._12_4_;
  fVar189 = auVar63._0_4_;
  fVar153 = auVar63._4_4_;
  fVar190 = auVar63._8_4_;
  fVar154 = auVar63._12_4_;
  auVar270._0_4_ = fVar189 * auVar70._0_4_ + fVar191 * auVar111._0_4_ + fVar172 * auVar140._0_4_;
  auVar270._4_4_ = fVar153 * auVar70._4_4_ + fVar204 * auVar111._4_4_ + fVar143 * auVar140._4_4_;
  auVar270._8_4_ = fVar190 * auVar70._8_4_ + fVar205 * auVar111._8_4_ + fVar188 * auVar140._8_4_;
  auVar270._12_4_ = fVar154 * auVar70._12_4_ + fVar206 * auVar111._12_4_ + fVar152 * auVar140._12_4_
  ;
  auVar282._0_4_ = fVar189 * auVar11._0_4_ + fVar191 * auVar12._0_4_ + auVar13._0_4_ * fVar172;
  auVar282._4_4_ = fVar153 * auVar11._4_4_ + fVar204 * auVar12._4_4_ + auVar13._4_4_ * fVar143;
  auVar282._8_4_ = fVar190 * auVar11._8_4_ + fVar205 * auVar12._8_4_ + auVar13._8_4_ * fVar188;
  auVar282._12_4_ = fVar154 * auVar11._12_4_ + fVar206 * auVar12._12_4_ + auVar13._12_4_ * fVar152;
  auVar208._0_4_ = fVar189 * auVar64._0_4_ + fVar191 * auVar97._0_4_ + auVar126._0_4_ * fVar172;
  auVar208._4_4_ = fVar153 * auVar64._4_4_ + fVar204 * auVar97._4_4_ + auVar126._4_4_ * fVar143;
  auVar208._8_4_ = fVar190 * auVar64._8_4_ + fVar205 * auVar97._8_4_ + auVar126._8_4_ * fVar188;
  auVar208._12_4_ = fVar154 * auVar64._12_4_ + fVar206 * auVar97._12_4_ + auVar126._12_4_ * fVar152;
  auVar63 = vshufps_avx(auVar116,auVar116,0);
  auVar91 = vshufps_avx(auVar116,auVar116,0x55);
  auVar117 = vshufps_avx(auVar116,auVar116,0xaa);
  fVar172 = auVar117._0_4_;
  fVar143 = auVar117._4_4_;
  fVar188 = auVar117._8_4_;
  fVar152 = auVar117._12_4_;
  fVar191 = auVar91._0_4_;
  fVar204 = auVar91._4_4_;
  fVar205 = auVar91._8_4_;
  fVar206 = auVar91._12_4_;
  fVar189 = auVar63._0_4_;
  fVar153 = auVar63._4_4_;
  fVar190 = auVar63._8_4_;
  fVar154 = auVar63._12_4_;
  auVar155._0_4_ = fVar189 * auVar70._0_4_ + fVar191 * auVar111._0_4_ + fVar172 * auVar140._0_4_;
  auVar155._4_4_ = fVar153 * auVar70._4_4_ + fVar204 * auVar111._4_4_ + fVar143 * auVar140._4_4_;
  auVar155._8_4_ = fVar190 * auVar70._8_4_ + fVar205 * auVar111._8_4_ + fVar188 * auVar140._8_4_;
  auVar155._12_4_ = fVar154 * auVar70._12_4_ + fVar206 * auVar111._12_4_ + fVar152 * auVar140._12_4_
  ;
  auVar91._0_4_ = fVar189 * auVar11._0_4_ + auVar13._0_4_ * fVar172 + fVar191 * auVar12._0_4_;
  auVar91._4_4_ = fVar153 * auVar11._4_4_ + auVar13._4_4_ * fVar143 + fVar204 * auVar12._4_4_;
  auVar91._8_4_ = fVar190 * auVar11._8_4_ + auVar13._8_4_ * fVar188 + fVar205 * auVar12._8_4_;
  auVar91._12_4_ = fVar154 * auVar11._12_4_ + auVar13._12_4_ * fVar152 + fVar206 * auVar12._12_4_;
  auVar63._0_4_ = fVar189 * auVar64._0_4_ + fVar191 * auVar97._0_4_ + auVar126._0_4_ * fVar172;
  auVar63._4_4_ = fVar153 * auVar64._4_4_ + fVar204 * auVar97._4_4_ + auVar126._4_4_ * fVar143;
  auVar63._8_4_ = fVar190 * auVar64._8_4_ + fVar205 * auVar97._8_4_ + auVar126._8_4_ * fVar188;
  auVar63._12_4_ = fVar154 * auVar64._12_4_ + fVar206 * auVar97._12_4_ + auVar126._12_4_ * fVar152;
  auVar192._8_4_ = 0x7fffffff;
  auVar192._0_8_ = 0x7fffffff7fffffff;
  auVar192._12_4_ = 0x7fffffff;
  auVar70 = vandps_avx(auVar270,auVar192);
  auVar144._8_4_ = 0x219392ef;
  auVar144._0_8_ = 0x219392ef219392ef;
  auVar144._12_4_ = 0x219392ef;
  auVar70 = vcmpps_avx(auVar70,auVar144,1);
  auVar111 = vblendvps_avx(auVar270,auVar144,auVar70);
  auVar70 = vandps_avx(auVar282,auVar192);
  auVar70 = vcmpps_avx(auVar70,auVar144,1);
  auVar140 = vblendvps_avx(auVar282,auVar144,auVar70);
  auVar70 = vandps_avx(auVar208,auVar192);
  auVar70 = vcmpps_avx(auVar70,auVar144,1);
  auVar70 = vblendvps_avx(auVar208,auVar144,auVar70);
  auVar11 = vrcpps_avx(auVar111);
  fVar191 = auVar11._0_4_;
  auVar117._0_4_ = fVar191 * auVar111._0_4_;
  fVar204 = auVar11._4_4_;
  auVar117._4_4_ = fVar204 * auVar111._4_4_;
  fVar205 = auVar11._8_4_;
  auVar117._8_4_ = fVar205 * auVar111._8_4_;
  fVar206 = auVar11._12_4_;
  auVar117._12_4_ = fVar206 * auVar111._12_4_;
  auVar209._8_4_ = 0x3f800000;
  auVar209._0_8_ = 0x3f8000003f800000;
  auVar209._12_4_ = 0x3f800000;
  auVar111 = vsubps_avx(auVar209,auVar117);
  fVar191 = fVar191 + fVar191 * auVar111._0_4_;
  fVar204 = fVar204 + fVar204 * auVar111._4_4_;
  fVar205 = fVar205 + fVar205 * auVar111._8_4_;
  fVar206 = fVar206 + fVar206 * auVar111._12_4_;
  auVar111 = vrcpps_avx(auVar140);
  fVar172 = auVar111._0_4_;
  auVar173._0_4_ = fVar172 * auVar140._0_4_;
  fVar188 = auVar111._4_4_;
  auVar173._4_4_ = fVar188 * auVar140._4_4_;
  fVar189 = auVar111._8_4_;
  auVar173._8_4_ = fVar189 * auVar140._8_4_;
  fVar190 = auVar111._12_4_;
  auVar173._12_4_ = fVar190 * auVar140._12_4_;
  auVar111 = vsubps_avx(auVar209,auVar173);
  fVar172 = fVar172 + fVar172 * auVar111._0_4_;
  fVar188 = fVar188 + fVar188 * auVar111._4_4_;
  fVar189 = fVar189 + fVar189 * auVar111._8_4_;
  fVar190 = fVar190 + fVar190 * auVar111._12_4_;
  auVar111 = vrcpps_avx(auVar70);
  fVar143 = auVar111._0_4_;
  auVar145._0_4_ = fVar143 * auVar70._0_4_;
  fVar152 = auVar111._4_4_;
  auVar145._4_4_ = fVar152 * auVar70._4_4_;
  fVar153 = auVar111._8_4_;
  auVar145._8_4_ = fVar153 * auVar70._8_4_;
  fVar154 = auVar111._12_4_;
  auVar145._12_4_ = fVar154 * auVar70._12_4_;
  auVar70 = vsubps_avx(auVar209,auVar145);
  fVar143 = fVar143 + fVar143 * auVar70._0_4_;
  fVar152 = fVar152 + fVar152 * auVar70._4_4_;
  fVar153 = fVar153 + fVar153 * auVar70._8_4_;
  fVar154 = fVar154 + fVar154 * auVar70._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar70 = vpmovsxwd_avx(auVar70);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar155);
  auVar118._0_4_ = fVar191 * auVar70._0_4_;
  auVar118._4_4_ = fVar204 * auVar70._4_4_;
  auVar118._8_4_ = fVar205 * auVar70._8_4_;
  auVar118._12_4_ = fVar206 * auVar70._12_4_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar70 = vpmovsxwd_avx(auVar111);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar155);
  auVar156._0_4_ = fVar191 * auVar70._0_4_;
  auVar156._4_4_ = fVar204 * auVar70._4_4_;
  auVar156._8_4_ = fVar205 * auVar70._8_4_;
  auVar156._12_4_ = fVar206 * auVar70._12_4_;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar111 = vpmovsxwd_avx(auVar140);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar58 * -2 + 6);
  auVar70 = vpmovsxwd_avx(auVar11);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar91);
  auVar220._0_4_ = auVar70._0_4_ * fVar172;
  auVar220._4_4_ = auVar70._4_4_ * fVar188;
  auVar220._8_4_ = auVar70._8_4_ * fVar189;
  auVar220._12_4_ = auVar70._12_4_ * fVar190;
  auVar70 = vcvtdq2ps_avx(auVar111);
  auVar70 = vsubps_avx(auVar70,auVar91);
  auVar126._0_4_ = fVar172 * auVar70._0_4_;
  auVar126._4_4_ = fVar188 * auVar70._4_4_;
  auVar126._8_4_ = fVar189 * auVar70._8_4_;
  auVar126._12_4_ = fVar190 * auVar70._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar56 + uVar58 + 6);
  auVar70 = vpmovsxwd_avx(auVar12);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar63);
  auVar174._0_4_ = auVar70._0_4_ * fVar143;
  auVar174._4_4_ = auVar70._4_4_ * fVar152;
  auVar174._8_4_ = auVar70._8_4_ * fVar153;
  auVar174._12_4_ = auVar70._12_4_ * fVar154;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar58 * 0x17 + 6);
  auVar70 = vpmovsxwd_avx(auVar13);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,auVar63);
  auVar64._0_4_ = auVar70._0_4_ * fVar143;
  auVar64._4_4_ = auVar70._4_4_ * fVar152;
  auVar64._8_4_ = auVar70._8_4_ * fVar153;
  auVar64._12_4_ = auVar70._12_4_ * fVar154;
  auVar70 = vpminsd_avx(auVar118,auVar156);
  auVar111 = vpminsd_avx(auVar220,auVar126);
  auVar70 = vmaxps_avx(auVar70,auVar111);
  auVar111 = vpminsd_avx(auVar174,auVar64);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar232._4_4_ = uVar4;
  auVar232._0_4_ = uVar4;
  auVar232._8_4_ = uVar4;
  auVar232._12_4_ = uVar4;
  auVar111 = vmaxps_avx(auVar111,auVar232);
  auVar70 = vmaxps_avx(auVar70,auVar111);
  local_388._0_4_ = auVar70._0_4_ * 0.99999964;
  local_388._4_4_ = auVar70._4_4_ * 0.99999964;
  local_388._8_4_ = auVar70._8_4_ * 0.99999964;
  local_388._12_4_ = auVar70._12_4_ * 0.99999964;
  auVar70 = vpmaxsd_avx(auVar118,auVar156);
  auVar111 = vpmaxsd_avx(auVar220,auVar126);
  auVar70 = vminps_avx(auVar70,auVar111);
  auVar111 = vpmaxsd_avx(auVar174,auVar64);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar119._4_4_ = uVar4;
  auVar119._0_4_ = uVar4;
  auVar119._8_4_ = uVar4;
  auVar119._12_4_ = uVar4;
  auVar111 = vminps_avx(auVar111,auVar119);
  auVar70 = vminps_avx(auVar70,auVar111);
  auVar97._0_4_ = auVar70._0_4_ * 1.0000004;
  auVar97._4_4_ = auVar70._4_4_ * 1.0000004;
  auVar97._8_4_ = auVar70._8_4_ * 1.0000004;
  auVar97._12_4_ = auVar70._12_4_ * 1.0000004;
  auVar70 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar111 = vpcmpgtd_avx(auVar70,_DAT_01f7fcf0);
  auVar70 = vcmpps_avx(local_388,auVar97,2);
  auVar70 = vandps_avx(auVar70,auVar111);
  uVar54 = vmovmskps_avx(auVar70);
  if (uVar54 == 0) {
    return;
  }
  uVar54 = uVar54 & 0xff;
  auVar83._16_16_ = mm_lookupmask_ps._240_16_;
  auVar83._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,0x80);
  local_480 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  do {
    lVar57 = 0;
    if ((ulong)uVar54 != 0) {
      for (; (uVar54 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
      }
    }
    uVar55 = *(uint *)(prim + 2);
    local_478 = (ulong)*(uint *)(prim + lVar57 * 4 + 6);
    pGVar7 = (context->scene->geometries).items[uVar55].ptr;
    lVar8 = *(long *)&pGVar7[1].time_range.upper;
    uVar56 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                             local_478 *
                             pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    pfVar2 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar56);
    fVar191 = *pfVar2;
    fVar204 = pfVar2[1];
    fVar205 = pfVar2[2];
    fVar206 = pfVar2[3];
    lVar1 = uVar56 + 1;
    auVar70 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar1);
    pfVar2 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar56);
    _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    pfVar3 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar1);
    auVar120._0_4_ = *pfVar3 * 0.33333334;
    auVar120._4_4_ = pfVar3[1] * 0.33333334;
    auVar120._8_4_ = pfVar3[2] * 0.33333334;
    auVar120._12_4_ = pfVar3[3] * 0.33333334;
    pfVar3 = (float *)(_Var9 + (long)pGVar7[2].userPtr * uVar56);
    fVar61 = *pfVar3;
    fVar62 = pfVar3[1];
    fVar89 = pfVar3[2];
    fVar90 = pfVar3[3];
    pfVar3 = (float *)((long)pGVar7[3].userPtr + uVar56 * *(long *)&pGVar7[3].fnumTimeSegments);
    auVar111 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar1);
    auVar140 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar11 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    fVar219 = fVar191 + *pfVar2 * 0.33333334;
    fVar229 = fVar204 + pfVar2[1] * 0.33333334;
    fVar230 = fVar205 + pfVar2[2] * 0.33333334;
    fVar231 = fVar206 + pfVar2[3] * 0.33333334;
    auVar140 = vsubps_avx(auVar70,auVar120);
    fVar246 = fVar61 + *pfVar3 * 0.33333334;
    fVar254 = fVar62 + pfVar3[1] * 0.33333334;
    fVar255 = fVar89 + pfVar3[2] * 0.33333334;
    fVar256 = fVar90 + pfVar3[3] * 0.33333334;
    pfVar2 = (float *)((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar1);
    auVar92._0_4_ = *pfVar2 * 0.33333334;
    auVar92._4_4_ = pfVar2[1] * 0.33333334;
    auVar92._8_4_ = pfVar2[2] * 0.33333334;
    auVar92._12_4_ = pfVar2[3] * 0.33333334;
    auVar12 = vsubps_avx(auVar111,auVar92);
    fVar172 = auVar70._0_4_;
    fVar188 = auVar70._4_4_;
    fVar189 = auVar70._8_4_;
    fVar190 = auVar70._12_4_;
    fVar257 = auVar140._0_4_ * 0.0;
    fVar266 = auVar140._4_4_ * 0.0;
    fVar267 = auVar140._8_4_ * 0.0;
    fVar268 = auVar140._12_4_ * 0.0;
    fVar143 = fVar257 + fVar172 * 0.0;
    fVar152 = fVar266 + fVar188 * 0.0;
    fVar153 = fVar267 + fVar189 * 0.0;
    fVar154 = fVar268 + fVar190 * 0.0;
    fVar269 = fVar219 * 0.0;
    fVar274 = fVar229 * 0.0;
    fVar275 = fVar230 * 0.0;
    fVar276 = fVar231 * 0.0;
    local_5e8._0_4_ = fVar191 + fVar269 + fVar143;
    local_5e8._4_4_ = fVar204 + fVar274 + fVar152;
    fStack_5e0 = fVar205 + fVar275 + fVar153;
    fStack_5dc = fVar206 + fVar276 + fVar154;
    auVar121._0_4_ = fVar219 * 3.0 + fVar143;
    auVar121._4_4_ = fVar229 * 3.0 + fVar152;
    auVar121._8_4_ = fVar230 * 3.0 + fVar153;
    auVar121._12_4_ = fVar231 * 3.0 + fVar154;
    auVar221._0_4_ = fVar191 * 3.0;
    auVar221._4_4_ = fVar204 * 3.0;
    auVar221._8_4_ = fVar205 * 3.0;
    auVar221._12_4_ = fVar206 * 3.0;
    auVar91 = vsubps_avx(auVar121,auVar221);
    fVar143 = auVar111._0_4_;
    fVar152 = auVar111._4_4_;
    fVar153 = auVar111._8_4_;
    fVar154 = auVar111._12_4_;
    fVar281 = auVar12._0_4_ * 0.0;
    fVar285 = auVar12._4_4_ * 0.0;
    fVar286 = auVar12._8_4_ * 0.0;
    fVar287 = auVar12._12_4_ * 0.0;
    fVar219 = fVar143 * 0.0 + fVar281;
    fVar229 = fVar152 * 0.0 + fVar285;
    fVar230 = fVar153 * 0.0 + fVar286;
    fVar231 = fVar154 * 0.0 + fVar287;
    fVar289 = fVar246 * 0.0;
    fVar295 = fVar254 * 0.0;
    fVar296 = fVar255 * 0.0;
    fVar297 = fVar256 * 0.0;
    auVar298._0_4_ = fVar289 + fVar219 + fVar61;
    auVar298._4_4_ = fVar295 + fVar229 + fVar62;
    auVar298._8_4_ = fVar296 + fVar230 + fVar89;
    auVar298._12_4_ = fVar297 + fVar231 + fVar90;
    auVar222._0_4_ = fVar246 * 3.0 + fVar219;
    auVar222._4_4_ = fVar254 * 3.0 + fVar229;
    auVar222._8_4_ = fVar255 * 3.0 + fVar230;
    auVar222._12_4_ = fVar256 * 3.0 + fVar231;
    auVar247._0_4_ = fVar61 * 3.0;
    auVar247._4_4_ = fVar62 * 3.0;
    auVar247._8_4_ = fVar89 * 3.0;
    auVar247._12_4_ = fVar90 * 3.0;
    auVar13 = vsubps_avx(auVar222,auVar247);
    auVar258._0_4_ = fVar191 * 0.0;
    auVar258._4_4_ = fVar204 * 0.0;
    auVar258._8_4_ = fVar205 * 0.0;
    auVar258._12_4_ = fVar206 * 0.0;
    auVar146._0_4_ = auVar258._0_4_ + fVar269 + fVar257 + fVar172;
    auVar146._4_4_ = auVar258._4_4_ + fVar274 + fVar266 + fVar188;
    auVar146._8_4_ = auVar258._8_4_ + fVar275 + fVar267 + fVar189;
    auVar146._12_4_ = auVar258._12_4_ + fVar276 + fVar268 + fVar190;
    auVar157._0_4_ = fVar172 * 3.0;
    auVar157._4_4_ = fVar188 * 3.0;
    auVar157._8_4_ = fVar189 * 3.0;
    auVar157._12_4_ = fVar190 * 3.0;
    auVar223._0_4_ = auVar140._0_4_ * 3.0;
    auVar223._4_4_ = auVar140._4_4_ * 3.0;
    auVar223._8_4_ = auVar140._8_4_ * 3.0;
    auVar223._12_4_ = auVar140._12_4_ * 3.0;
    auVar70 = vsubps_avx(auVar157,auVar223);
    auVar158._0_4_ = fVar269 + auVar70._0_4_;
    auVar158._4_4_ = fVar274 + auVar70._4_4_;
    auVar158._8_4_ = fVar275 + auVar70._8_4_;
    auVar158._12_4_ = fVar276 + auVar70._12_4_;
    auVar117 = vsubps_avx(auVar158,auVar258);
    auVar175._0_4_ = fVar61 * 0.0;
    auVar175._4_4_ = fVar62 * 0.0;
    auVar175._8_4_ = fVar89 * 0.0;
    auVar175._12_4_ = fVar90 * 0.0;
    auVar233._0_4_ = fVar289 + fVar281 + fVar143 + auVar175._0_4_;
    auVar233._4_4_ = fVar295 + fVar285 + fVar152 + auVar175._4_4_;
    auVar233._8_4_ = fVar296 + fVar286 + fVar153 + auVar175._8_4_;
    auVar233._12_4_ = fVar297 + fVar287 + fVar154 + auVar175._12_4_;
    auVar193._0_4_ = fVar143 * 3.0;
    auVar193._4_4_ = fVar152 * 3.0;
    auVar193._8_4_ = fVar153 * 3.0;
    auVar193._12_4_ = fVar154 * 3.0;
    auVar210._0_4_ = auVar12._0_4_ * 3.0;
    auVar210._4_4_ = auVar12._4_4_ * 3.0;
    auVar210._8_4_ = auVar12._8_4_ * 3.0;
    auVar210._12_4_ = auVar12._12_4_ * 3.0;
    auVar70 = vsubps_avx(auVar193,auVar210);
    auVar194._0_4_ = fVar289 + auVar70._0_4_;
    auVar194._4_4_ = fVar295 + auVar70._4_4_;
    auVar194._8_4_ = fVar296 + auVar70._8_4_;
    auVar194._12_4_ = fVar297 + auVar70._12_4_;
    auVar64 = vsubps_avx(auVar194,auVar175);
    auVar70 = vshufps_avx(auVar91,auVar91,0xc9);
    auVar111 = vshufps_avx(auVar298,auVar298,0xc9);
    fVar219 = auVar91._0_4_;
    auVar211._0_4_ = fVar219 * auVar111._0_4_;
    fVar230 = auVar91._4_4_;
    auVar211._4_4_ = fVar230 * auVar111._4_4_;
    fVar246 = auVar91._8_4_;
    auVar211._8_4_ = fVar246 * auVar111._8_4_;
    fVar255 = auVar91._12_4_;
    auVar211._12_4_ = fVar255 * auVar111._12_4_;
    auVar224._0_4_ = auVar298._0_4_ * auVar70._0_4_;
    auVar224._4_4_ = auVar298._4_4_ * auVar70._4_4_;
    auVar224._8_4_ = auVar298._8_4_ * auVar70._8_4_;
    auVar224._12_4_ = auVar298._12_4_ * auVar70._12_4_;
    auVar111 = vsubps_avx(auVar224,auVar211);
    auVar140 = vshufps_avx(auVar111,auVar111,0xc9);
    auVar111 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar212._0_4_ = fVar219 * auVar111._0_4_;
    auVar212._4_4_ = fVar230 * auVar111._4_4_;
    auVar212._8_4_ = fVar246 * auVar111._8_4_;
    auVar212._12_4_ = fVar255 * auVar111._12_4_;
    auVar176._0_4_ = auVar13._0_4_ * auVar70._0_4_;
    auVar176._4_4_ = auVar13._4_4_ * auVar70._4_4_;
    auVar176._8_4_ = auVar13._8_4_ * auVar70._8_4_;
    auVar176._12_4_ = auVar13._12_4_ * auVar70._12_4_;
    auVar70 = vsubps_avx(auVar176,auVar212);
    auVar12 = vshufps_avx(auVar70,auVar70,0xc9);
    auVar70 = vshufps_avx(auVar117,auVar117,0xc9);
    auVar111 = vshufps_avx(auVar233,auVar233,0xc9);
    fVar257 = auVar117._0_4_;
    auVar177._0_4_ = fVar257 * auVar111._0_4_;
    fVar266 = auVar117._4_4_;
    auVar177._4_4_ = fVar266 * auVar111._4_4_;
    fVar267 = auVar117._8_4_;
    auVar177._8_4_ = fVar267 * auVar111._8_4_;
    fVar268 = auVar117._12_4_;
    auVar177._12_4_ = fVar268 * auVar111._12_4_;
    auVar234._0_4_ = auVar233._0_4_ * auVar70._0_4_;
    auVar234._4_4_ = auVar233._4_4_ * auVar70._4_4_;
    auVar234._8_4_ = auVar233._8_4_ * auVar70._8_4_;
    auVar234._12_4_ = auVar233._12_4_ * auVar70._12_4_;
    auVar111 = vsubps_avx(auVar234,auVar177);
    auVar13 = vshufps_avx(auVar111,auVar111,0xc9);
    auVar111 = vshufps_avx(auVar64,auVar64,0xc9);
    auVar235._0_4_ = auVar111._0_4_ * fVar257;
    auVar235._4_4_ = auVar111._4_4_ * fVar266;
    auVar235._8_4_ = auVar111._8_4_ * fVar267;
    auVar235._12_4_ = auVar111._12_4_ * fVar268;
    auVar195._0_4_ = auVar70._0_4_ * auVar64._0_4_;
    auVar195._4_4_ = auVar70._4_4_ * auVar64._4_4_;
    auVar195._8_4_ = auVar70._8_4_ * auVar64._8_4_;
    auVar195._12_4_ = auVar70._12_4_ * auVar64._12_4_;
    auVar111 = vsubps_avx(auVar195,auVar235);
    auVar70 = vdpps_avx(auVar140,auVar140,0x7f);
    auVar64 = vshufps_avx(auVar111,auVar111,0xc9);
    fVar189 = auVar70._0_4_;
    auVar126 = ZEXT416((uint)fVar189);
    auVar111 = vrsqrtss_avx(auVar126,auVar126);
    fVar172 = auVar111._0_4_;
    auVar111 = vdpps_avx(auVar140,auVar12,0x7f);
    auVar97 = ZEXT416((uint)(fVar172 * 1.5 - fVar189 * 0.5 * fVar172 * fVar172 * fVar172));
    auVar97 = vshufps_avx(auVar97,auVar97,0);
    fVar172 = auVar140._0_4_ * auVar97._0_4_;
    fVar143 = auVar140._4_4_ * auVar97._4_4_;
    fVar188 = auVar140._8_4_ * auVar97._8_4_;
    fVar152 = auVar140._12_4_ * auVar97._12_4_;
    auVar70 = vshufps_avx(auVar70,auVar70,0);
    auVar248._0_4_ = auVar70._0_4_ * auVar12._0_4_;
    auVar248._4_4_ = auVar70._4_4_ * auVar12._4_4_;
    auVar248._8_4_ = auVar70._8_4_ * auVar12._8_4_;
    auVar248._12_4_ = auVar70._12_4_ * auVar12._12_4_;
    auVar70 = vshufps_avx(auVar111,auVar111,0);
    auVar225._0_4_ = auVar70._0_4_ * auVar140._0_4_;
    auVar225._4_4_ = auVar70._4_4_ * auVar140._4_4_;
    auVar225._8_4_ = auVar70._8_4_ * auVar140._8_4_;
    auVar225._12_4_ = auVar70._12_4_ * auVar140._12_4_;
    auVar116 = vsubps_avx(auVar248,auVar225);
    auVar70 = vrcpss_avx(auVar126,auVar126);
    auVar111 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar70 = ZEXT416((uint)(auVar70._0_4_ * (2.0 - fVar189 * auVar70._0_4_)));
    auVar12 = vshufps_avx(auVar70,auVar70,0);
    auVar70 = vblendps_avx(auVar111,_DAT_01f7aa10,0xe);
    auVar140 = vrsqrtss_avx(auVar70,auVar70);
    fVar189 = auVar140._0_4_;
    auVar140 = ZEXT416((uint)(fVar189 * 1.5 - auVar111._0_4_ * 0.5 * fVar189 * fVar189 * fVar189));
    auVar126 = vshufps_avx(auVar140,auVar140,0);
    auVar140 = vdpps_avx(auVar13,auVar64,0x7f);
    fVar189 = auVar126._0_4_ * auVar13._0_4_;
    fVar153 = auVar126._4_4_ * auVar13._4_4_;
    fVar190 = auVar126._8_4_ * auVar13._8_4_;
    fVar154 = auVar126._12_4_ * auVar13._12_4_;
    auVar63 = vshufps_avx(auVar111,auVar111,0);
    auVar213._0_4_ = auVar63._0_4_ * auVar64._0_4_;
    auVar213._4_4_ = auVar63._4_4_ * auVar64._4_4_;
    auVar213._8_4_ = auVar63._8_4_ * auVar64._8_4_;
    auVar213._12_4_ = auVar63._12_4_ * auVar64._12_4_;
    auVar140 = vshufps_avx(auVar140,auVar140,0);
    auVar178._0_4_ = auVar140._0_4_ * auVar13._0_4_;
    auVar178._4_4_ = auVar140._4_4_ * auVar13._4_4_;
    auVar178._8_4_ = auVar140._8_4_ * auVar13._8_4_;
    auVar178._12_4_ = auVar140._12_4_ * auVar13._12_4_;
    auVar13 = vsubps_avx(auVar213,auVar178);
    auVar70 = vrcpss_avx(auVar70,auVar70);
    auVar70 = ZEXT416((uint)((2.0 - auVar111._0_4_ * auVar70._0_4_) * auVar70._0_4_));
    auVar70 = vshufps_avx(auVar70,auVar70,0);
    auVar111 = vshufps_avx(_local_5e8,_local_5e8,0xff);
    auVar236._0_4_ = auVar111._0_4_ * fVar172;
    auVar236._4_4_ = auVar111._4_4_ * fVar143;
    auVar236._8_4_ = auVar111._8_4_ * fVar188;
    auVar236._12_4_ = auVar111._12_4_ * fVar152;
    _local_3e8 = vsubps_avx(_local_5e8,auVar236);
    auVar140 = vshufps_avx(auVar91,auVar91,0xff);
    auVar196._0_4_ =
         auVar140._0_4_ * fVar172 + auVar97._0_4_ * auVar116._0_4_ * auVar12._0_4_ * auVar111._0_4_;
    auVar196._4_4_ =
         auVar140._4_4_ * fVar143 + auVar97._4_4_ * auVar116._4_4_ * auVar12._4_4_ * auVar111._4_4_;
    auVar196._8_4_ =
         auVar140._8_4_ * fVar188 + auVar97._8_4_ * auVar116._8_4_ * auVar12._8_4_ * auVar111._8_4_;
    auVar196._12_4_ =
         auVar140._12_4_ * fVar152 +
         auVar97._12_4_ * auVar116._12_4_ * auVar12._12_4_ * auVar111._12_4_;
    auVar12 = vsubps_avx(auVar91,auVar196);
    local_3f8._0_4_ = auVar236._0_4_ + (float)local_5e8._0_4_;
    local_3f8._4_4_ = auVar236._4_4_ + (float)local_5e8._4_4_;
    fStack_3f0 = auVar236._8_4_ + fStack_5e0;
    fStack_3ec = auVar236._12_4_ + fStack_5dc;
    auVar111 = vshufps_avx(auVar146,auVar146,0xff);
    auVar122._0_4_ = fVar189 * auVar111._0_4_;
    auVar122._4_4_ = fVar153 * auVar111._4_4_;
    auVar122._8_4_ = fVar190 * auVar111._8_4_;
    auVar122._12_4_ = fVar154 * auVar111._12_4_;
    _local_408 = vsubps_avx(auVar146,auVar122);
    auVar140 = vshufps_avx(auVar117,auVar117,0xff);
    auVar93._0_4_ =
         fVar189 * auVar140._0_4_ + auVar111._0_4_ * auVar126._0_4_ * auVar13._0_4_ * auVar70._0_4_;
    auVar93._4_4_ =
         fVar153 * auVar140._4_4_ + auVar111._4_4_ * auVar126._4_4_ * auVar13._4_4_ * auVar70._4_4_;
    auVar93._8_4_ =
         fVar190 * auVar140._8_4_ + auVar111._8_4_ * auVar126._8_4_ * auVar13._8_4_ * auVar70._8_4_;
    auVar93._12_4_ =
         fVar154 * auVar140._12_4_ +
         auVar111._12_4_ * auVar126._12_4_ * auVar13._12_4_ * auVar70._12_4_;
    auVar13 = vsubps_avx(auVar117,auVar93);
    fVar229 = auVar146._0_4_ + auVar122._0_4_;
    fVar231 = auVar146._4_4_ + auVar122._4_4_;
    fVar254 = auVar146._8_4_ + auVar122._8_4_;
    fVar256 = auVar146._12_4_ + auVar122._12_4_;
    local_418._0_4_ = local_3e8._0_4_ + auVar12._0_4_ * 0.33333334;
    local_418._4_4_ = local_3e8._4_4_ + auVar12._4_4_ * 0.33333334;
    fStack_410 = local_3e8._8_4_ + auVar12._8_4_ * 0.33333334;
    fStack_40c = local_3e8._12_4_ + auVar12._12_4_ * 0.33333334;
    local_2a8 = vsubps_avx(_local_3e8,auVar11);
    auVar111 = vmovsldup_avx(local_2a8);
    auVar70 = vmovshdup_avx(local_2a8);
    auVar140 = vshufps_avx(local_2a8,local_2a8,0xaa);
    fVar172 = pre->ray_space[k].vx.field_0.m128[0];
    fVar143 = pre->ray_space[k].vx.field_0.m128[1];
    fVar188 = pre->ray_space[k].vx.field_0.m128[2];
    fVar152 = pre->ray_space[k].vx.field_0.m128[3];
    fVar189 = pre->ray_space[k].vy.field_0.m128[0];
    fVar153 = pre->ray_space[k].vy.field_0.m128[1];
    fVar190 = pre->ray_space[k].vy.field_0.m128[2];
    fVar154 = pre->ray_space[k].vy.field_0.m128[3];
    fVar191 = pre->ray_space[k].vz.field_0.m128[0];
    fVar204 = pre->ray_space[k].vz.field_0.m128[1];
    fVar205 = pre->ray_space[k].vz.field_0.m128[2];
    fVar206 = pre->ray_space[k].vz.field_0.m128[3];
    fVar61 = fVar172 * auVar111._0_4_ + auVar140._0_4_ * fVar191 + fVar189 * auVar70._0_4_;
    fVar89 = fVar143 * auVar111._4_4_ + auVar140._4_4_ * fVar204 + fVar153 * auVar70._4_4_;
    local_5e8._4_4_ = fVar89;
    local_5e8._0_4_ = fVar61;
    fStack_5e0 = fVar188 * auVar111._8_4_ + auVar140._8_4_ * fVar205 + fVar190 * auVar70._8_4_;
    fStack_5dc = fVar152 * auVar111._12_4_ + auVar140._12_4_ * fVar206 + fVar154 * auVar70._12_4_;
    local_2b8 = vsubps_avx(_local_418,auVar11);
    auVar140 = vshufps_avx(local_2b8,local_2b8,0xaa);
    auVar70 = vmovshdup_avx(local_2b8);
    auVar111 = vmovsldup_avx(local_2b8);
    fVar62 = auVar111._0_4_ * fVar172 + auVar70._0_4_ * fVar189 + fVar191 * auVar140._0_4_;
    fVar90 = auVar111._4_4_ * fVar143 + auVar70._4_4_ * fVar153 + fVar204 * auVar140._4_4_;
    local_568._4_4_ = fVar90;
    local_568._0_4_ = fVar62;
    fStack_560 = auVar111._8_4_ * fVar188 + auVar70._8_4_ * fVar190 + fVar205 * auVar140._8_4_;
    fStack_55c = auVar111._12_4_ * fVar152 + auVar70._12_4_ * fVar154 + fVar206 * auVar140._12_4_;
    auVar179._0_4_ = auVar13._0_4_ * 0.33333334;
    auVar179._4_4_ = auVar13._4_4_ * 0.33333334;
    auVar179._8_4_ = auVar13._8_4_ * 0.33333334;
    auVar179._12_4_ = auVar13._12_4_ * 0.33333334;
    _local_428 = vsubps_avx(_local_408,auVar179);
    local_2c8 = vsubps_avx(_local_428,auVar11);
    auVar140 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar70 = vmovshdup_avx(local_2c8);
    auVar111 = vmovsldup_avx(local_2c8);
    auVar299._0_4_ = auVar111._0_4_ * fVar172 + auVar70._0_4_ * fVar189 + fVar191 * auVar140._0_4_;
    auVar299._4_4_ = auVar111._4_4_ * fVar143 + auVar70._4_4_ * fVar153 + fVar204 * auVar140._4_4_;
    auVar299._8_4_ = auVar111._8_4_ * fVar188 + auVar70._8_4_ * fVar190 + fVar205 * auVar140._8_4_;
    auVar299._12_4_ =
         auVar111._12_4_ * fVar152 + auVar70._12_4_ * fVar154 + fVar206 * auVar140._12_4_;
    local_2d8 = vsubps_avx(_local_408,auVar11);
    auVar140 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar70 = vmovshdup_avx(local_2d8);
    auVar111 = vmovsldup_avx(local_2d8);
    auVar290._0_4_ = auVar111._0_4_ * fVar172 + auVar70._0_4_ * fVar189 + auVar140._0_4_ * fVar191;
    auVar290._4_4_ = auVar111._4_4_ * fVar143 + auVar70._4_4_ * fVar153 + auVar140._4_4_ * fVar204;
    auVar290._8_4_ = auVar111._8_4_ * fVar188 + auVar70._8_4_ * fVar190 + auVar140._8_4_ * fVar205;
    auVar290._12_4_ =
         auVar111._12_4_ * fVar152 + auVar70._12_4_ * fVar154 + auVar140._12_4_ * fVar206;
    local_2e8 = vsubps_avx(_local_3f8,auVar11);
    auVar140 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar70 = vmovshdup_avx(local_2e8);
    auVar111 = vmovsldup_avx(local_2e8);
    auVar283._0_4_ = auVar111._0_4_ * fVar172 + auVar70._0_4_ * fVar189 + auVar140._0_4_ * fVar191;
    auVar283._4_4_ = auVar111._4_4_ * fVar143 + auVar70._4_4_ * fVar153 + auVar140._4_4_ * fVar204;
    auVar283._8_4_ = auVar111._8_4_ * fVar188 + auVar70._8_4_ * fVar190 + auVar140._8_4_ * fVar205;
    auVar283._12_4_ =
         auVar111._12_4_ * fVar152 + auVar70._12_4_ * fVar154 + auVar140._12_4_ * fVar206;
    local_438._0_4_ = (float)local_3f8._0_4_ + (fVar219 + auVar196._0_4_) * 0.33333334;
    local_438._4_4_ = (float)local_3f8._4_4_ + (fVar230 + auVar196._4_4_) * 0.33333334;
    fStack_430 = fStack_3f0 + (fVar246 + auVar196._8_4_) * 0.33333334;
    fStack_42c = fStack_3ec + (fVar255 + auVar196._12_4_) * 0.33333334;
    local_2f8 = vsubps_avx(_local_438,auVar11);
    auVar140 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar70 = vmovshdup_avx(local_2f8);
    auVar111 = vmovsldup_avx(local_2f8);
    auVar249._0_4_ = auVar111._0_4_ * fVar172 + auVar70._0_4_ * fVar189 + auVar140._0_4_ * fVar191;
    auVar249._4_4_ = auVar111._4_4_ * fVar143 + auVar70._4_4_ * fVar153 + auVar140._4_4_ * fVar204;
    auVar249._8_4_ = auVar111._8_4_ * fVar188 + auVar70._8_4_ * fVar190 + auVar140._8_4_ * fVar205;
    auVar249._12_4_ =
         auVar111._12_4_ * fVar152 + auVar70._12_4_ * fVar154 + auVar140._12_4_ * fVar206;
    auVar214._0_4_ = (fVar257 + auVar93._0_4_) * 0.33333334;
    auVar214._4_4_ = (fVar266 + auVar93._4_4_) * 0.33333334;
    auVar214._8_4_ = (fVar267 + auVar93._8_4_) * 0.33333334;
    auVar214._12_4_ = (fVar268 + auVar93._12_4_) * 0.33333334;
    auVar52._4_4_ = fVar231;
    auVar52._0_4_ = fVar229;
    auVar52._8_4_ = fVar254;
    auVar52._12_4_ = fVar256;
    _local_338 = vsubps_avx(auVar52,auVar214);
    local_308 = vsubps_avx(_local_338,auVar11);
    auVar140 = vshufps_avx(local_308,local_308,0xaa);
    auVar70 = vmovshdup_avx(local_308);
    auVar111 = vmovsldup_avx(local_308);
    auVar94._0_4_ = auVar111._0_4_ * fVar172 + auVar70._0_4_ * fVar189 + fVar191 * auVar140._0_4_;
    auVar94._4_4_ = auVar111._4_4_ * fVar143 + auVar70._4_4_ * fVar153 + fVar204 * auVar140._4_4_;
    auVar94._8_4_ = auVar111._8_4_ * fVar188 + auVar70._8_4_ * fVar190 + fVar205 * auVar140._8_4_;
    auVar94._12_4_ =
         auVar111._12_4_ * fVar152 + auVar70._12_4_ * fVar154 + fVar206 * auVar140._12_4_;
    local_318 = vsubps_avx(auVar52,auVar11);
    auVar140 = vshufps_avx(local_318,local_318,0xaa);
    auVar70 = vmovshdup_avx(local_318);
    auVar111 = vmovsldup_avx(local_318);
    auVar65._0_4_ = fVar172 * auVar111._0_4_ + fVar189 * auVar70._0_4_ + fVar191 * auVar140._0_4_;
    auVar65._4_4_ = fVar143 * auVar111._4_4_ + fVar153 * auVar70._4_4_ + fVar204 * auVar140._4_4_;
    auVar65._8_4_ = fVar188 * auVar111._8_4_ + fVar190 * auVar70._8_4_ + fVar205 * auVar140._8_4_;
    auVar65._12_4_ =
         fVar152 * auVar111._12_4_ + fVar154 * auVar70._12_4_ + fVar206 * auVar140._12_4_;
    auVar11 = vmovlhps_avx(_local_5e8,auVar283);
    auVar12 = vmovlhps_avx(_local_568,auVar249);
    auVar13 = vmovlhps_avx(auVar299,auVar94);
    _local_258 = vmovlhps_avx(auVar290,auVar65);
    auVar70 = vminps_avx(auVar11,auVar12);
    auVar111 = vminps_avx(auVar13,_local_258);
    auVar140 = vminps_avx(auVar70,auVar111);
    auVar70 = vmaxps_avx(auVar11,auVar12);
    auVar111 = vmaxps_avx(auVar13,_local_258);
    auVar70 = vmaxps_avx(auVar70,auVar111);
    auVar111 = vshufpd_avx(auVar140,auVar140,3);
    auVar140 = vminps_avx(auVar140,auVar111);
    auVar111 = vshufpd_avx(auVar70,auVar70,3);
    auVar111 = vmaxps_avx(auVar70,auVar111);
    auVar197._8_4_ = 0x7fffffff;
    auVar197._0_8_ = 0x7fffffff7fffffff;
    auVar197._12_4_ = 0x7fffffff;
    auVar70 = vandps_avx(auVar140,auVar197);
    auVar111 = vandps_avx(auVar111,auVar197);
    auVar70 = vmaxps_avx(auVar70,auVar111);
    auVar111 = vmovshdup_avx(auVar70);
    auVar70 = vmaxss_avx(auVar111,auVar70);
    local_470 = (ulong)uVar54 + 0xf;
    fVar172 = auVar70._0_4_ * 9.536743e-07;
    local_268 = ZEXT416((uint)fVar172);
    auVar70 = vshufps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172),0);
    local_228._16_16_ = auVar70;
    local_228._0_16_ = auVar70;
    auVar66._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
    auVar66._8_4_ = auVar70._8_4_ ^ 0x80000000;
    auVar66._12_4_ = auVar70._12_4_ ^ 0x80000000;
    local_248._16_16_ = auVar66;
    local_248._0_16_ = auVar66;
    local_398 = vpshufd_avx(ZEXT416(uVar55),0);
    local_3a8 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar57 * 4 + 6)),0);
    uVar60 = 0;
    fVar172 = *(float *)(ray + k * 4 + 0x30);
    _local_278 = vsubps_avx(auVar12,auVar11);
    _local_288 = vsubps_avx(auVar13,auVar12);
    _local_298 = vsubps_avx(_local_258,auVar13);
    _local_348 = vsubps_avx(_local_3f8,_local_3e8);
    _local_358 = vsubps_avx(_local_438,_local_418);
    _local_368 = vsubps_avx(_local_338,_local_428);
    auVar53._4_4_ = fVar231;
    auVar53._0_4_ = fVar229;
    auVar53._8_4_ = fVar254;
    auVar53._12_4_ = fVar256;
    _local_378 = vsubps_avx(auVar53,_local_408);
    auVar265 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar273 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00e65b1a:
    auVar118 = auVar265._0_16_;
    auVar119 = auVar273._0_16_;
    local_328 = auVar119;
    auVar70 = vshufps_avx(auVar118,auVar118,0x50);
    auVar291._8_4_ = 0x3f800000;
    auVar291._0_8_ = 0x3f8000003f800000;
    auVar291._12_4_ = 0x3f800000;
    auVar294._16_4_ = 0x3f800000;
    auVar294._0_16_ = auVar291;
    auVar294._20_4_ = 0x3f800000;
    auVar294._24_4_ = 0x3f800000;
    auVar294._28_4_ = 0x3f800000;
    auVar111 = vsubps_avx(auVar291,auVar70);
    fVar143 = auVar70._0_4_;
    fVar188 = auVar70._4_4_;
    fVar152 = auVar70._8_4_;
    fVar189 = auVar70._12_4_;
    fVar153 = auVar111._0_4_;
    fVar190 = auVar111._4_4_;
    fVar154 = auVar111._8_4_;
    fVar191 = auVar111._12_4_;
    auVar147._0_4_ = auVar283._0_4_ * fVar143 + fVar153 * fVar61;
    auVar147._4_4_ = auVar283._4_4_ * fVar188 + fVar190 * fVar89;
    auVar147._8_4_ = auVar283._0_4_ * fVar152 + fVar154 * fVar61;
    auVar147._12_4_ = auVar283._4_4_ * fVar189 + fVar191 * fVar89;
    auVar123._0_4_ = auVar249._0_4_ * fVar143 + fVar153 * fVar62;
    auVar123._4_4_ = auVar249._4_4_ * fVar188 + fVar190 * fVar90;
    auVar123._8_4_ = auVar249._0_4_ * fVar152 + fVar154 * fVar62;
    auVar123._12_4_ = auVar249._4_4_ * fVar189 + fVar191 * fVar90;
    auVar215._0_4_ = auVar94._0_4_ * fVar143 + auVar299._0_4_ * fVar153;
    auVar215._4_4_ = auVar94._4_4_ * fVar188 + auVar299._4_4_ * fVar190;
    auVar215._8_4_ = auVar94._0_4_ * fVar152 + auVar299._0_4_ * fVar154;
    auVar215._12_4_ = auVar94._4_4_ * fVar189 + auVar299._4_4_ * fVar191;
    auVar159._0_4_ = auVar65._0_4_ * fVar143 + auVar290._0_4_ * fVar153;
    auVar159._4_4_ = auVar65._4_4_ * fVar188 + auVar290._4_4_ * fVar190;
    auVar159._8_4_ = auVar65._0_4_ * fVar152 + auVar290._0_4_ * fVar154;
    auVar159._12_4_ = auVar65._4_4_ * fVar189 + auVar290._4_4_ * fVar191;
    auVar70 = vmovshdup_avx(auVar119);
    auVar111 = vshufps_avx(auVar119,auVar119,0);
    auVar240._16_16_ = auVar111;
    auVar240._0_16_ = auVar111;
    auVar140 = vshufps_avx(auVar119,auVar119,0x55);
    auVar84._16_16_ = auVar140;
    auVar84._0_16_ = auVar140;
    auVar83 = vsubps_avx(auVar84,auVar240);
    auVar140 = vshufps_avx(auVar147,auVar147,0);
    auVar64 = vshufps_avx(auVar147,auVar147,0x55);
    auVar97 = vshufps_avx(auVar123,auVar123,0);
    auVar126 = vshufps_avx(auVar123,auVar123,0x55);
    auVar63 = vshufps_avx(auVar215,auVar215,0);
    auVar91 = vshufps_avx(auVar215,auVar215,0x55);
    auVar117 = vshufps_avx(auVar159,auVar159,0);
    auVar116 = vshufps_avx(auVar159,auVar159,0x55);
    auVar70 = ZEXT416((uint)((auVar70._0_4_ - auVar273._0_4_) * 0.04761905));
    auVar70 = vshufps_avx(auVar70,auVar70,0);
    auVar253._0_4_ = auVar111._0_4_ + auVar83._0_4_ * 0.0;
    auVar253._4_4_ = auVar111._4_4_ + auVar83._4_4_ * 0.14285715;
    auVar253._8_4_ = auVar111._8_4_ + auVar83._8_4_ * 0.2857143;
    auVar253._12_4_ = auVar111._12_4_ + auVar83._12_4_ * 0.42857146;
    auVar253._16_4_ = auVar111._0_4_ + auVar83._16_4_ * 0.5714286;
    auVar253._20_4_ = auVar111._4_4_ + auVar83._20_4_ * 0.71428573;
    auVar253._24_4_ = auVar111._8_4_ + auVar83._24_4_ * 0.8571429;
    auVar253._28_4_ = auVar111._12_4_ + auVar83._28_4_;
    auVar14 = vsubps_avx(auVar294,auVar253);
    fVar143 = auVar97._0_4_;
    fVar152 = auVar97._4_4_;
    fVar153 = auVar97._8_4_;
    fVar154 = auVar97._12_4_;
    fVar295 = auVar14._0_4_;
    fVar296 = auVar14._4_4_;
    fVar297 = auVar14._8_4_;
    fVar242 = auVar14._12_4_;
    fVar243 = auVar14._16_4_;
    fVar244 = auVar14._20_4_;
    fVar245 = auVar14._24_4_;
    fVar274 = auVar126._0_4_;
    fVar276 = auVar126._4_4_;
    fVar285 = auVar126._8_4_;
    fVar287 = auVar126._12_4_;
    fVar288 = auVar64._12_4_ + 1.0;
    fVar266 = auVar63._0_4_;
    fVar267 = auVar63._4_4_;
    fVar268 = auVar63._8_4_;
    fVar269 = auVar63._12_4_;
    fVar204 = fVar266 * auVar253._0_4_ + fVar295 * fVar143;
    fVar205 = fVar267 * auVar253._4_4_ + fVar296 * fVar152;
    fVar206 = fVar268 * auVar253._8_4_ + fVar297 * fVar153;
    fVar219 = fVar269 * auVar253._12_4_ + fVar242 * fVar154;
    fVar230 = fVar266 * auVar253._16_4_ + fVar243 * fVar143;
    fVar246 = fVar267 * auVar253._20_4_ + fVar244 * fVar152;
    fVar255 = fVar268 * auVar253._24_4_ + fVar245 * fVar153;
    fVar188 = auVar91._0_4_;
    fVar189 = auVar91._4_4_;
    fVar190 = auVar91._8_4_;
    fVar191 = auVar91._12_4_;
    fVar275 = fVar274 * fVar295 + auVar253._0_4_ * fVar188;
    fVar281 = fVar276 * fVar296 + auVar253._4_4_ * fVar189;
    fVar286 = fVar285 * fVar297 + auVar253._8_4_ * fVar190;
    fVar289 = fVar287 * fVar242 + auVar253._12_4_ * fVar191;
    fVar277 = fVar274 * fVar243 + auVar253._16_4_ * fVar188;
    fVar278 = fVar276 * fVar244 + auVar253._20_4_ * fVar189;
    fVar279 = fVar285 * fVar245 + auVar253._24_4_ * fVar190;
    fVar280 = fVar287 + fVar154;
    auVar111 = vshufps_avx(auVar147,auVar147,0xaa);
    auVar97 = vshufps_avx(auVar147,auVar147,0xff);
    fVar257 = fVar269 + 0.0;
    auVar126 = vshufps_avx(auVar123,auVar123,0xaa);
    auVar63 = vshufps_avx(auVar123,auVar123,0xff);
    auVar170._0_4_ =
         fVar295 * (auVar253._0_4_ * fVar143 + fVar295 * auVar140._0_4_) + auVar253._0_4_ * fVar204;
    auVar170._4_4_ =
         fVar296 * (auVar253._4_4_ * fVar152 + fVar296 * auVar140._4_4_) + auVar253._4_4_ * fVar205;
    auVar170._8_4_ =
         fVar297 * (auVar253._8_4_ * fVar153 + fVar297 * auVar140._8_4_) + auVar253._8_4_ * fVar206;
    auVar170._12_4_ =
         fVar242 * (auVar253._12_4_ * fVar154 + fVar242 * auVar140._12_4_) +
         auVar253._12_4_ * fVar219;
    auVar170._16_4_ =
         fVar243 * (auVar253._16_4_ * fVar143 + fVar243 * auVar140._0_4_) +
         auVar253._16_4_ * fVar230;
    auVar170._20_4_ =
         fVar244 * (auVar253._20_4_ * fVar152 + fVar244 * auVar140._4_4_) +
         auVar253._20_4_ * fVar246;
    auVar170._24_4_ =
         fVar245 * (auVar253._24_4_ * fVar153 + fVar245 * auVar140._8_4_) +
         auVar253._24_4_ * fVar255;
    auVar170._28_4_ = auVar140._12_4_ + 1.0 + fVar191;
    auVar186._0_4_ =
         fVar295 * (fVar274 * auVar253._0_4_ + auVar64._0_4_ * fVar295) + auVar253._0_4_ * fVar275;
    auVar186._4_4_ =
         fVar296 * (fVar276 * auVar253._4_4_ + auVar64._4_4_ * fVar296) + auVar253._4_4_ * fVar281;
    auVar186._8_4_ =
         fVar297 * (fVar285 * auVar253._8_4_ + auVar64._8_4_ * fVar297) + auVar253._8_4_ * fVar286;
    auVar186._12_4_ =
         fVar242 * (fVar287 * auVar253._12_4_ + auVar64._12_4_ * fVar242) +
         auVar253._12_4_ * fVar289;
    auVar186._16_4_ =
         fVar243 * (fVar274 * auVar253._16_4_ + auVar64._0_4_ * fVar243) + auVar253._16_4_ * fVar277
    ;
    auVar186._20_4_ =
         fVar244 * (fVar276 * auVar253._20_4_ + auVar64._4_4_ * fVar244) + auVar253._20_4_ * fVar278
    ;
    auVar186._24_4_ =
         fVar245 * (fVar285 * auVar253._24_4_ + auVar64._8_4_ * fVar245) + auVar253._24_4_ * fVar279
    ;
    auVar186._28_4_ = auVar116._12_4_ + fVar191;
    auVar85._0_4_ =
         fVar295 * fVar204 + auVar253._0_4_ * (fVar266 * fVar295 + auVar117._0_4_ * auVar253._0_4_);
    auVar85._4_4_ =
         fVar296 * fVar205 + auVar253._4_4_ * (fVar267 * fVar296 + auVar117._4_4_ * auVar253._4_4_);
    auVar85._8_4_ =
         fVar297 * fVar206 + auVar253._8_4_ * (fVar268 * fVar297 + auVar117._8_4_ * auVar253._8_4_);
    auVar85._12_4_ =
         fVar242 * fVar219 +
         auVar253._12_4_ * (fVar269 * fVar242 + auVar117._12_4_ * auVar253._12_4_);
    auVar85._16_4_ =
         fVar243 * fVar230 +
         auVar253._16_4_ * (fVar266 * fVar243 + auVar117._0_4_ * auVar253._16_4_);
    auVar85._20_4_ =
         fVar244 * fVar246 +
         auVar253._20_4_ * (fVar267 * fVar244 + auVar117._4_4_ * auVar253._20_4_);
    auVar85._24_4_ =
         fVar245 * fVar255 +
         auVar253._24_4_ * (fVar268 * fVar245 + auVar117._8_4_ * auVar253._24_4_);
    auVar85._28_4_ = fVar154 + 1.0 + fVar257;
    auVar264._0_4_ =
         fVar295 * fVar275 + auVar253._0_4_ * (auVar116._0_4_ * auVar253._0_4_ + fVar295 * fVar188);
    auVar264._4_4_ =
         fVar296 * fVar281 + auVar253._4_4_ * (auVar116._4_4_ * auVar253._4_4_ + fVar296 * fVar189);
    auVar264._8_4_ =
         fVar297 * fVar286 + auVar253._8_4_ * (auVar116._8_4_ * auVar253._8_4_ + fVar297 * fVar190);
    auVar264._12_4_ =
         fVar242 * fVar289 +
         auVar253._12_4_ * (auVar116._12_4_ * auVar253._12_4_ + fVar242 * fVar191);
    auVar264._16_4_ =
         fVar243 * fVar277 +
         auVar253._16_4_ * (auVar116._0_4_ * auVar253._16_4_ + fVar243 * fVar188);
    auVar264._20_4_ =
         fVar244 * fVar278 +
         auVar253._20_4_ * (auVar116._4_4_ * auVar253._20_4_ + fVar244 * fVar189);
    auVar264._24_4_ =
         fVar245 * fVar279 +
         auVar253._24_4_ * (auVar116._8_4_ * auVar253._24_4_ + fVar245 * fVar190);
    auVar264._28_4_ = fVar257 + fVar191 + 0.0;
    local_98._0_4_ = fVar295 * auVar170._0_4_ + auVar253._0_4_ * auVar85._0_4_;
    local_98._4_4_ = fVar296 * auVar170._4_4_ + auVar253._4_4_ * auVar85._4_4_;
    local_98._8_4_ = fVar297 * auVar170._8_4_ + auVar253._8_4_ * auVar85._8_4_;
    local_98._12_4_ = fVar242 * auVar170._12_4_ + auVar253._12_4_ * auVar85._12_4_;
    local_98._16_4_ = fVar243 * auVar170._16_4_ + auVar253._16_4_ * auVar85._16_4_;
    local_98._20_4_ = fVar244 * auVar170._20_4_ + auVar253._20_4_ * auVar85._20_4_;
    local_98._24_4_ = fVar245 * auVar170._24_4_ + auVar253._24_4_ * auVar85._24_4_;
    local_98._28_4_ = fVar280 + fVar191 + 0.0;
    auVar151._0_4_ = fVar295 * auVar186._0_4_ + auVar253._0_4_ * auVar264._0_4_;
    auVar151._4_4_ = fVar296 * auVar186._4_4_ + auVar253._4_4_ * auVar264._4_4_;
    auVar151._8_4_ = fVar297 * auVar186._8_4_ + auVar253._8_4_ * auVar264._8_4_;
    auVar151._12_4_ = fVar242 * auVar186._12_4_ + auVar253._12_4_ * auVar264._12_4_;
    auVar151._16_4_ = fVar243 * auVar186._16_4_ + auVar253._16_4_ * auVar264._16_4_;
    auVar151._20_4_ = fVar244 * auVar186._20_4_ + auVar253._20_4_ * auVar264._20_4_;
    auVar151._24_4_ = fVar245 * auVar186._24_4_ + auVar253._24_4_ * auVar264._24_4_;
    auVar151._28_4_ = fVar280 + fVar257;
    auVar15 = vsubps_avx(auVar85,auVar170);
    auVar83 = vsubps_avx(auVar264,auVar186);
    local_4d8 = auVar70._0_4_;
    fStack_4d4 = auVar70._4_4_;
    fStack_4d0 = auVar70._8_4_;
    fStack_4cc = auVar70._12_4_;
    local_d8 = local_4d8 * auVar15._0_4_ * 3.0;
    fStack_d4 = fStack_4d4 * auVar15._4_4_ * 3.0;
    auVar16._4_4_ = fStack_d4;
    auVar16._0_4_ = local_d8;
    fStack_d0 = fStack_4d0 * auVar15._8_4_ * 3.0;
    auVar16._8_4_ = fStack_d0;
    fStack_cc = fStack_4cc * auVar15._12_4_ * 3.0;
    auVar16._12_4_ = fStack_cc;
    fStack_c8 = local_4d8 * auVar15._16_4_ * 3.0;
    auVar16._16_4_ = fStack_c8;
    fStack_c4 = fStack_4d4 * auVar15._20_4_ * 3.0;
    auVar16._20_4_ = fStack_c4;
    fStack_c0 = fStack_4d0 * auVar15._24_4_ * 3.0;
    auVar16._24_4_ = fStack_c0;
    auVar16._28_4_ = auVar15._28_4_;
    local_f8 = local_4d8 * auVar83._0_4_ * 3.0;
    fStack_f4 = fStack_4d4 * auVar83._4_4_ * 3.0;
    auVar17._4_4_ = fStack_f4;
    auVar17._0_4_ = local_f8;
    fStack_f0 = fStack_4d0 * auVar83._8_4_ * 3.0;
    auVar17._8_4_ = fStack_f0;
    fStack_ec = fStack_4cc * auVar83._12_4_ * 3.0;
    auVar17._12_4_ = fStack_ec;
    fStack_e8 = local_4d8 * auVar83._16_4_ * 3.0;
    auVar17._16_4_ = fStack_e8;
    fStack_e4 = fStack_4d4 * auVar83._20_4_ * 3.0;
    auVar17._20_4_ = fStack_e4;
    fStack_e0 = fStack_4d0 * auVar83._24_4_ * 3.0;
    auVar17._24_4_ = fStack_e0;
    auVar17._28_4_ = fVar280;
    auVar16 = vsubps_avx(local_98,auVar16);
    auVar83 = vperm2f128_avx(auVar16,auVar16,1);
    auVar83 = vshufps_avx(auVar83,auVar16,0x30);
    auVar83 = vshufps_avx(auVar16,auVar83,0x29);
    auVar17 = vsubps_avx(auVar151,auVar17);
    auVar16 = vperm2f128_avx(auVar17,auVar17,1);
    auVar16 = vshufps_avx(auVar16,auVar17,0x30);
    auVar17 = vshufps_avx(auVar17,auVar16,0x29);
    fVar278 = auVar126._0_4_;
    fVar279 = auVar126._4_4_;
    fVar301 = auVar126._8_4_;
    fVar154 = auVar111._12_4_;
    fVar267 = auVar63._0_4_;
    fVar269 = auVar63._4_4_;
    fVar275 = auVar63._8_4_;
    fVar281 = auVar63._12_4_;
    auVar70 = vshufps_avx(auVar215,auVar215,0xaa);
    fVar143 = auVar70._0_4_;
    fVar152 = auVar70._4_4_;
    fVar153 = auVar70._8_4_;
    fVar191 = auVar70._12_4_;
    fVar206 = auVar253._0_4_ * fVar143 + fVar278 * fVar295;
    fVar219 = auVar253._4_4_ * fVar152 + fVar279 * fVar296;
    fVar230 = auVar253._8_4_ * fVar153 + fVar301 * fVar297;
    fVar246 = auVar253._12_4_ * fVar191 + auVar126._12_4_ * fVar242;
    fVar255 = auVar253._16_4_ * fVar143 + fVar278 * fVar243;
    fVar257 = auVar253._20_4_ * fVar152 + fVar279 * fVar244;
    fVar266 = auVar253._24_4_ * fVar153 + fVar301 * fVar245;
    auVar70 = vshufps_avx(auVar215,auVar215,0xff);
    fVar188 = auVar70._0_4_;
    fVar189 = auVar70._4_4_;
    fVar190 = auVar70._8_4_;
    fVar204 = auVar70._12_4_;
    fVar268 = auVar253._0_4_ * fVar188 + fVar267 * fVar295;
    fVar274 = auVar253._4_4_ * fVar189 + fVar269 * fVar296;
    fVar276 = auVar253._8_4_ * fVar190 + fVar275 * fVar297;
    fVar285 = auVar253._12_4_ * fVar204 + fVar281 * fVar242;
    fVar286 = auVar253._16_4_ * fVar188 + fVar267 * fVar243;
    fVar287 = auVar253._20_4_ * fVar189 + fVar269 * fVar244;
    fVar289 = auVar253._24_4_ * fVar190 + fVar275 * fVar245;
    auVar70 = vshufps_avx(auVar159,auVar159,0xaa);
    fVar277 = auVar70._12_4_ + fVar191;
    auVar140 = vshufps_avx(auVar159,auVar159,0xff);
    fVar205 = auVar140._12_4_;
    auVar86._0_4_ =
         fVar295 * (fVar278 * auVar253._0_4_ + fVar295 * auVar111._0_4_) + auVar253._0_4_ * fVar206;
    auVar86._4_4_ =
         fVar296 * (fVar279 * auVar253._4_4_ + fVar296 * auVar111._4_4_) + auVar253._4_4_ * fVar219;
    auVar86._8_4_ =
         fVar297 * (fVar301 * auVar253._8_4_ + fVar297 * auVar111._8_4_) + auVar253._8_4_ * fVar230;
    auVar86._12_4_ =
         fVar242 * (auVar126._12_4_ * auVar253._12_4_ + fVar242 * fVar154) +
         auVar253._12_4_ * fVar246;
    auVar86._16_4_ =
         fVar243 * (fVar278 * auVar253._16_4_ + fVar243 * auVar111._0_4_) +
         auVar253._16_4_ * fVar255;
    auVar86._20_4_ =
         fVar244 * (fVar279 * auVar253._20_4_ + fVar244 * auVar111._4_4_) +
         auVar253._20_4_ * fVar257;
    auVar86._24_4_ =
         fVar245 * (fVar301 * auVar253._24_4_ + fVar245 * auVar111._8_4_) +
         auVar253._24_4_ * fVar266;
    auVar86._28_4_ = auVar17._28_4_ + fVar154 + fVar205;
    auVar112._0_4_ =
         fVar295 * (fVar267 * auVar253._0_4_ + auVar97._0_4_ * fVar295) + auVar253._0_4_ * fVar268;
    auVar112._4_4_ =
         fVar296 * (fVar269 * auVar253._4_4_ + auVar97._4_4_ * fVar296) + auVar253._4_4_ * fVar274;
    auVar112._8_4_ =
         fVar297 * (fVar275 * auVar253._8_4_ + auVar97._8_4_ * fVar297) + auVar253._8_4_ * fVar276;
    auVar112._12_4_ =
         fVar242 * (fVar281 * auVar253._12_4_ + auVar97._12_4_ * fVar242) +
         auVar253._12_4_ * fVar285;
    auVar112._16_4_ =
         fVar243 * (fVar267 * auVar253._16_4_ + auVar97._0_4_ * fVar243) + auVar253._16_4_ * fVar286
    ;
    auVar112._20_4_ =
         fVar244 * (fVar269 * auVar253._20_4_ + auVar97._4_4_ * fVar244) + auVar253._20_4_ * fVar287
    ;
    auVar112._24_4_ =
         fVar245 * (fVar275 * auVar253._24_4_ + auVar97._8_4_ * fVar245) + auVar253._24_4_ * fVar289
    ;
    auVar112._28_4_ = fVar154 + auVar16._28_4_ + fVar205;
    auVar16 = vperm2f128_avx(local_98,local_98,1);
    auVar16 = vshufps_avx(auVar16,local_98,0x30);
    _local_3d8 = vshufps_avx(local_98,auVar16,0x29);
    auVar187._0_4_ =
         auVar253._0_4_ * (auVar70._0_4_ * auVar253._0_4_ + fVar295 * fVar143) + fVar295 * fVar206;
    auVar187._4_4_ =
         auVar253._4_4_ * (auVar70._4_4_ * auVar253._4_4_ + fVar296 * fVar152) + fVar296 * fVar219;
    auVar187._8_4_ =
         auVar253._8_4_ * (auVar70._8_4_ * auVar253._8_4_ + fVar297 * fVar153) + fVar297 * fVar230;
    auVar187._12_4_ =
         auVar253._12_4_ * (auVar70._12_4_ * auVar253._12_4_ + fVar242 * fVar191) +
         fVar242 * fVar246;
    auVar187._16_4_ =
         auVar253._16_4_ * (auVar70._0_4_ * auVar253._16_4_ + fVar243 * fVar143) + fVar243 * fVar255
    ;
    auVar187._20_4_ =
         auVar253._20_4_ * (auVar70._4_4_ * auVar253._20_4_ + fVar244 * fVar152) + fVar244 * fVar257
    ;
    auVar187._24_4_ =
         auVar253._24_4_ * (auVar70._8_4_ * auVar253._24_4_ + fVar245 * fVar153) + fVar245 * fVar266
    ;
    auVar187._28_4_ = fVar277 + fVar288 + auVar186._28_4_;
    auVar228._0_4_ =
         fVar295 * fVar268 + auVar253._0_4_ * (auVar253._0_4_ * auVar140._0_4_ + fVar295 * fVar188);
    auVar228._4_4_ =
         fVar296 * fVar274 + auVar253._4_4_ * (auVar253._4_4_ * auVar140._4_4_ + fVar296 * fVar189);
    auVar228._8_4_ =
         fVar297 * fVar276 + auVar253._8_4_ * (auVar253._8_4_ * auVar140._8_4_ + fVar297 * fVar190);
    auVar228._12_4_ =
         fVar242 * fVar285 + auVar253._12_4_ * (auVar253._12_4_ * fVar205 + fVar242 * fVar204);
    auVar228._16_4_ =
         fVar243 * fVar286 +
         auVar253._16_4_ * (auVar253._16_4_ * auVar140._0_4_ + fVar243 * fVar188);
    auVar228._20_4_ =
         fVar244 * fVar287 +
         auVar253._20_4_ * (auVar253._20_4_ * auVar140._4_4_ + fVar244 * fVar189);
    auVar228._24_4_ =
         fVar245 * fVar289 +
         auVar253._24_4_ * (auVar253._24_4_ * auVar140._8_4_ + fVar245 * fVar190);
    auVar228._28_4_ = fVar288 + fVar281 + fVar205 + fVar204;
    auVar218._0_4_ = fVar295 * auVar86._0_4_ + auVar253._0_4_ * auVar187._0_4_;
    auVar218._4_4_ = fVar296 * auVar86._4_4_ + auVar253._4_4_ * auVar187._4_4_;
    auVar218._8_4_ = fVar297 * auVar86._8_4_ + auVar253._8_4_ * auVar187._8_4_;
    auVar218._12_4_ = fVar242 * auVar86._12_4_ + auVar253._12_4_ * auVar187._12_4_;
    auVar218._16_4_ = fVar243 * auVar86._16_4_ + auVar253._16_4_ * auVar187._16_4_;
    auVar218._20_4_ = fVar244 * auVar86._20_4_ + auVar253._20_4_ * auVar187._20_4_;
    auVar218._24_4_ = fVar245 * auVar86._24_4_ + auVar253._24_4_ * auVar187._24_4_;
    auVar218._28_4_ = fVar277 + fVar205 + fVar204;
    auVar241._0_4_ = fVar295 * auVar112._0_4_ + auVar253._0_4_ * auVar228._0_4_;
    auVar241._4_4_ = fVar296 * auVar112._4_4_ + auVar253._4_4_ * auVar228._4_4_;
    auVar241._8_4_ = fVar297 * auVar112._8_4_ + auVar253._8_4_ * auVar228._8_4_;
    auVar241._12_4_ = fVar242 * auVar112._12_4_ + auVar253._12_4_ * auVar228._12_4_;
    auVar241._16_4_ = fVar243 * auVar112._16_4_ + auVar253._16_4_ * auVar228._16_4_;
    auVar241._20_4_ = fVar244 * auVar112._20_4_ + auVar253._20_4_ * auVar228._20_4_;
    auVar241._24_4_ = fVar245 * auVar112._24_4_ + auVar253._24_4_ * auVar228._24_4_;
    auVar241._28_4_ = auVar14._28_4_ + auVar253._28_4_;
    auVar18 = vsubps_avx(auVar187,auVar86);
    auVar16 = vsubps_avx(auVar228,auVar112);
    local_118 = local_4d8 * auVar18._0_4_ * 3.0;
    fStack_114 = fStack_4d4 * auVar18._4_4_ * 3.0;
    auVar14._4_4_ = fStack_114;
    auVar14._0_4_ = local_118;
    fStack_110 = fStack_4d0 * auVar18._8_4_ * 3.0;
    auVar14._8_4_ = fStack_110;
    fStack_10c = fStack_4cc * auVar18._12_4_ * 3.0;
    auVar14._12_4_ = fStack_10c;
    fStack_108 = local_4d8 * auVar18._16_4_ * 3.0;
    auVar14._16_4_ = fStack_108;
    fStack_104 = fStack_4d4 * auVar18._20_4_ * 3.0;
    auVar14._20_4_ = fStack_104;
    fStack_100 = fStack_4d0 * auVar18._24_4_ * 3.0;
    auVar14._24_4_ = fStack_100;
    auVar14._28_4_ = auVar18._28_4_;
    local_138 = local_4d8 * auVar16._0_4_ * 3.0;
    fStack_134 = fStack_4d4 * auVar16._4_4_ * 3.0;
    auVar19._4_4_ = fStack_134;
    auVar19._0_4_ = local_138;
    fStack_130 = fStack_4d0 * auVar16._8_4_ * 3.0;
    auVar19._8_4_ = fStack_130;
    fStack_12c = fStack_4cc * auVar16._12_4_ * 3.0;
    auVar19._12_4_ = fStack_12c;
    fStack_128 = local_4d8 * auVar16._16_4_ * 3.0;
    auVar19._16_4_ = fStack_128;
    fStack_124 = fStack_4d4 * auVar16._20_4_ * 3.0;
    auVar19._20_4_ = fStack_124;
    fStack_120 = fStack_4d0 * auVar16._24_4_ * 3.0;
    auVar19._24_4_ = fStack_120;
    auVar19._28_4_ = auVar187._28_4_;
    auVar16 = vperm2f128_avx(auVar218,auVar218,1);
    auVar16 = vshufps_avx(auVar16,auVar218,0x30);
    auVar84 = vshufps_avx(auVar218,auVar16,0x29);
    auVar14 = vsubps_avx(auVar218,auVar14);
    auVar16 = vperm2f128_avx(auVar14,auVar14,1);
    auVar16 = vshufps_avx(auVar16,auVar14,0x30);
    auVar16 = vshufps_avx(auVar14,auVar16,0x29);
    auVar19 = vsubps_avx(auVar241,auVar19);
    auVar14 = vperm2f128_avx(auVar19,auVar19,1);
    auVar14 = vshufps_avx(auVar14,auVar19,0x30);
    auVar19 = vshufps_avx(auVar19,auVar14,0x29);
    auVar20 = vsubps_avx(auVar218,local_98);
    auVar85 = vsubps_avx(auVar84,_local_3d8);
    fVar143 = auVar85._0_4_ + auVar20._0_4_;
    fVar188 = auVar85._4_4_ + auVar20._4_4_;
    fVar152 = auVar85._8_4_ + auVar20._8_4_;
    fVar189 = auVar85._12_4_ + auVar20._12_4_;
    fVar153 = auVar85._16_4_ + auVar20._16_4_;
    fVar190 = auVar85._20_4_ + auVar20._20_4_;
    fVar154 = auVar85._24_4_ + auVar20._24_4_;
    auVar14 = vperm2f128_avx(auVar151,auVar151,1);
    auVar14 = vshufps_avx(auVar14,auVar151,0x30);
    local_b8 = vshufps_avx(auVar151,auVar14,0x29);
    auVar14 = vperm2f128_avx(auVar241,auVar241,1);
    auVar14 = vshufps_avx(auVar14,auVar241,0x30);
    local_78 = vshufps_avx(auVar241,auVar14,0x29);
    auVar14 = vsubps_avx(auVar241,auVar151);
    auVar86 = vsubps_avx(local_78,local_b8);
    fVar191 = auVar86._0_4_ + auVar14._0_4_;
    fVar204 = auVar86._4_4_ + auVar14._4_4_;
    fVar205 = auVar86._8_4_ + auVar14._8_4_;
    fVar206 = auVar86._12_4_ + auVar14._12_4_;
    fVar219 = auVar86._16_4_ + auVar14._16_4_;
    fVar230 = auVar86._20_4_ + auVar14._20_4_;
    fVar246 = auVar86._24_4_ + auVar14._24_4_;
    auVar21._4_4_ = fVar188 * auVar151._4_4_;
    auVar21._0_4_ = fVar143 * auVar151._0_4_;
    auVar21._8_4_ = fVar152 * auVar151._8_4_;
    auVar21._12_4_ = fVar189 * auVar151._12_4_;
    auVar21._16_4_ = fVar153 * auVar151._16_4_;
    auVar21._20_4_ = fVar190 * auVar151._20_4_;
    auVar21._24_4_ = fVar154 * auVar151._24_4_;
    auVar21._28_4_ = auVar14._28_4_;
    auVar22._4_4_ = fVar204 * local_98._4_4_;
    auVar22._0_4_ = fVar191 * local_98._0_4_;
    auVar22._8_4_ = fVar205 * local_98._8_4_;
    auVar22._12_4_ = fVar206 * local_98._12_4_;
    auVar22._16_4_ = fVar219 * local_98._16_4_;
    auVar22._20_4_ = fVar230 * local_98._20_4_;
    auVar22._24_4_ = fVar246 * local_98._24_4_;
    auVar22._28_4_ = fVar277;
    auVar21 = vsubps_avx(auVar21,auVar22);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar15._28_4_;
    local_f8 = local_f8 + auVar151._0_4_;
    fStack_f4 = fStack_f4 + auVar151._4_4_;
    fStack_f0 = fStack_f0 + auVar151._8_4_;
    fStack_ec = fStack_ec + auVar151._12_4_;
    fStack_e8 = fStack_e8 + auVar151._16_4_;
    fStack_e4 = fStack_e4 + auVar151._20_4_;
    fStack_e0 = fStack_e0 + auVar151._24_4_;
    fStack_dc = fVar280 + auVar151._28_4_;
    auVar15._4_4_ = fVar188 * fStack_f4;
    auVar15._0_4_ = fVar143 * local_f8;
    auVar15._8_4_ = fVar152 * fStack_f0;
    auVar15._12_4_ = fVar189 * fStack_ec;
    auVar15._16_4_ = fVar153 * fStack_e8;
    auVar15._20_4_ = fVar190 * fStack_e4;
    auVar15._24_4_ = fVar154 * fStack_e0;
    auVar15._28_4_ = fVar280;
    auVar23._4_4_ = fVar204 * fStack_d4;
    auVar23._0_4_ = fVar191 * local_d8;
    auVar23._8_4_ = fVar205 * fStack_d0;
    auVar23._12_4_ = fVar206 * fStack_cc;
    auVar23._16_4_ = fVar219 * fStack_c8;
    auVar23._20_4_ = fVar230 * fStack_c4;
    auVar23._24_4_ = fVar246 * fStack_c0;
    auVar23._28_4_ = fVar280 + auVar151._28_4_;
    auVar15 = vsubps_avx(auVar15,auVar23);
    local_4b8 = auVar17._0_4_;
    fStack_4b4 = auVar17._4_4_;
    fStack_4b0 = auVar17._8_4_;
    fStack_4ac = auVar17._12_4_;
    fStack_4a8 = auVar17._16_4_;
    fStack_4a4 = auVar17._20_4_;
    fStack_4a0 = auVar17._24_4_;
    auVar24._4_4_ = fVar188 * fStack_4b4;
    auVar24._0_4_ = fVar143 * local_4b8;
    auVar24._8_4_ = fVar152 * fStack_4b0;
    auVar24._12_4_ = fVar189 * fStack_4ac;
    auVar24._16_4_ = fVar153 * fStack_4a8;
    auVar24._20_4_ = fVar190 * fStack_4a4;
    auVar24._24_4_ = fVar154 * fStack_4a0;
    auVar24._28_4_ = fVar280;
    local_548 = auVar83._0_4_;
    fStack_544 = auVar83._4_4_;
    fStack_540 = auVar83._8_4_;
    fStack_53c = auVar83._12_4_;
    fStack_538 = auVar83._16_4_;
    fStack_534 = auVar83._20_4_;
    fStack_530 = auVar83._24_4_;
    auVar25._4_4_ = fVar204 * fStack_544;
    auVar25._0_4_ = fVar191 * local_548;
    auVar25._8_4_ = fVar205 * fStack_540;
    auVar25._12_4_ = fVar206 * fStack_53c;
    auVar25._16_4_ = fVar219 * fStack_538;
    auVar25._20_4_ = fVar230 * fStack_534;
    auVar25._24_4_ = fVar246 * fStack_530;
    auVar25._28_4_ = local_98._28_4_;
    auVar22 = vsubps_avx(auVar24,auVar25);
    auVar26._4_4_ = local_b8._4_4_ * fVar188;
    auVar26._0_4_ = local_b8._0_4_ * fVar143;
    auVar26._8_4_ = local_b8._8_4_ * fVar152;
    auVar26._12_4_ = local_b8._12_4_ * fVar189;
    auVar26._16_4_ = local_b8._16_4_ * fVar153;
    auVar26._20_4_ = local_b8._20_4_ * fVar190;
    auVar26._24_4_ = local_b8._24_4_ * fVar154;
    auVar26._28_4_ = fVar280;
    auVar27._4_4_ = local_3d8._4_4_ * fVar204;
    auVar27._0_4_ = local_3d8._0_4_ * fVar191;
    auVar27._8_4_ = local_3d8._8_4_ * fVar205;
    auVar27._12_4_ = local_3d8._12_4_ * fVar206;
    auVar27._16_4_ = local_3d8._16_4_ * fVar219;
    auVar27._20_4_ = local_3d8._20_4_ * fVar230;
    auVar27._24_4_ = local_3d8._24_4_ * fVar246;
    auVar27._28_4_ = local_b8._28_4_;
    local_4d8 = auVar16._0_4_;
    fStack_4d4 = auVar16._4_4_;
    fStack_4d0 = auVar16._8_4_;
    fStack_4cc = auVar16._12_4_;
    fStack_4c8 = auVar16._16_4_;
    fStack_4c4 = auVar16._20_4_;
    fStack_4c0 = auVar16._24_4_;
    auVar23 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = auVar241._4_4_ * fVar188;
    auVar28._0_4_ = auVar241._0_4_ * fVar143;
    auVar28._8_4_ = auVar241._8_4_ * fVar152;
    auVar28._12_4_ = auVar241._12_4_ * fVar189;
    auVar28._16_4_ = auVar241._16_4_ * fVar153;
    auVar28._20_4_ = auVar241._20_4_ * fVar190;
    auVar28._24_4_ = auVar241._24_4_ * fVar154;
    auVar28._28_4_ = fVar280;
    auVar29._4_4_ = fVar204 * auVar218._4_4_;
    auVar29._0_4_ = fVar191 * auVar218._0_4_;
    auVar29._8_4_ = fVar205 * auVar218._8_4_;
    auVar29._12_4_ = fVar206 * auVar218._12_4_;
    auVar29._16_4_ = fVar219 * auVar218._16_4_;
    auVar29._20_4_ = fVar230 * auVar218._20_4_;
    auVar29._24_4_ = fVar246 * auVar218._24_4_;
    auVar29._28_4_ = fStack_bc;
    auVar24 = vsubps_avx(auVar28,auVar29);
    local_118 = auVar218._0_4_ + local_118;
    fStack_114 = auVar218._4_4_ + fStack_114;
    fStack_110 = auVar218._8_4_ + fStack_110;
    fStack_10c = auVar218._12_4_ + fStack_10c;
    fStack_108 = auVar218._16_4_ + fStack_108;
    fStack_104 = auVar218._20_4_ + fStack_104;
    fStack_100 = auVar218._24_4_ + fStack_100;
    fStack_fc = auVar218._28_4_ + auVar18._28_4_;
    local_138 = auVar241._0_4_ + local_138;
    fStack_134 = auVar241._4_4_ + fStack_134;
    fStack_130 = auVar241._8_4_ + fStack_130;
    fStack_12c = auVar241._12_4_ + fStack_12c;
    fStack_128 = auVar241._16_4_ + fStack_128;
    fStack_124 = auVar241._20_4_ + fStack_124;
    fStack_120 = auVar241._24_4_ + fStack_120;
    fStack_11c = auVar241._28_4_ + auVar187._28_4_;
    auVar18._4_4_ = fVar188 * fStack_134;
    auVar18._0_4_ = fVar143 * local_138;
    auVar18._8_4_ = fVar152 * fStack_130;
    auVar18._12_4_ = fVar189 * fStack_12c;
    auVar18._16_4_ = fVar153 * fStack_128;
    auVar18._20_4_ = fVar190 * fStack_124;
    auVar18._24_4_ = fVar154 * fStack_120;
    auVar18._28_4_ = auVar241._28_4_ + auVar187._28_4_;
    auVar30._4_4_ = fStack_114 * fVar204;
    auVar30._0_4_ = local_118 * fVar191;
    auVar30._8_4_ = fStack_110 * fVar205;
    auVar30._12_4_ = fStack_10c * fVar206;
    auVar30._16_4_ = fStack_108 * fVar219;
    auVar30._20_4_ = fStack_104 * fVar230;
    auVar30._24_4_ = fStack_100 * fVar246;
    auVar30._28_4_ = fStack_fc;
    auVar18 = vsubps_avx(auVar18,auVar30);
    auVar31._4_4_ = fVar188 * auVar19._4_4_;
    auVar31._0_4_ = fVar143 * auVar19._0_4_;
    auVar31._8_4_ = fVar152 * auVar19._8_4_;
    auVar31._12_4_ = fVar189 * auVar19._12_4_;
    auVar31._16_4_ = fVar153 * auVar19._16_4_;
    auVar31._20_4_ = fVar190 * auVar19._20_4_;
    auVar31._24_4_ = fVar154 * auVar19._24_4_;
    auVar31._28_4_ = fStack_fc;
    auVar32._4_4_ = fVar204 * fStack_4d4;
    auVar32._0_4_ = fVar191 * local_4d8;
    auVar32._8_4_ = fVar205 * fStack_4d0;
    auVar32._12_4_ = fVar206 * fStack_4cc;
    auVar32._16_4_ = fVar219 * fStack_4c8;
    auVar32._20_4_ = fVar230 * fStack_4c4;
    auVar32._24_4_ = fVar246 * fStack_4c0;
    auVar32._28_4_ = auVar19._28_4_;
    auVar25 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = fVar188 * local_78._4_4_;
    auVar33._0_4_ = fVar143 * local_78._0_4_;
    auVar33._8_4_ = fVar152 * local_78._8_4_;
    auVar33._12_4_ = fVar189 * local_78._12_4_;
    auVar33._16_4_ = fVar153 * local_78._16_4_;
    auVar33._20_4_ = fVar190 * local_78._20_4_;
    auVar33._24_4_ = fVar154 * local_78._24_4_;
    auVar33._28_4_ = auVar85._28_4_ + auVar20._28_4_;
    auVar20._4_4_ = auVar84._4_4_ * fVar204;
    auVar20._0_4_ = auVar84._0_4_ * fVar191;
    auVar20._8_4_ = auVar84._8_4_ * fVar205;
    auVar20._12_4_ = auVar84._12_4_ * fVar206;
    auVar20._16_4_ = auVar84._16_4_ * fVar219;
    auVar20._20_4_ = auVar84._20_4_ * fVar230;
    auVar20._24_4_ = auVar84._24_4_ * fVar246;
    auVar20._28_4_ = auVar86._28_4_ + auVar14._28_4_;
    auVar20 = vsubps_avx(auVar33,auVar20);
    auVar16 = vminps_avx(auVar21,auVar15);
    auVar83 = vmaxps_avx(auVar21,auVar15);
    auVar17 = vminps_avx(auVar22,auVar23);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar22,auVar23);
    auVar83 = vmaxps_avx(auVar83,auVar16);
    auVar14 = vminps_avx(auVar24,auVar18);
    auVar16 = vmaxps_avx(auVar24,auVar18);
    auVar15 = vminps_avx(auVar25,auVar20);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar15 = vminps_avx(auVar17,auVar15);
    auVar17 = vmaxps_avx(auVar25,auVar20);
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar83,auVar16);
    auVar83 = vcmpps_avx(auVar15,local_228,2);
    auVar16 = vcmpps_avx(auVar16,local_248,5);
    auVar83 = vandps_avx(auVar16,auVar83);
    auVar16 = local_158 & auVar83;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      auVar16 = vsubps_avx(_local_3d8,local_98);
      auVar17 = vsubps_avx(auVar84,auVar218);
      fVar188 = auVar16._0_4_ + auVar17._0_4_;
      fVar152 = auVar16._4_4_ + auVar17._4_4_;
      fVar189 = auVar16._8_4_ + auVar17._8_4_;
      fVar153 = auVar16._12_4_ + auVar17._12_4_;
      fVar190 = auVar16._16_4_ + auVar17._16_4_;
      fVar154 = auVar16._20_4_ + auVar17._20_4_;
      fVar191 = auVar16._24_4_ + auVar17._24_4_;
      auVar15 = vsubps_avx(local_b8,auVar151);
      auVar18 = vsubps_avx(local_78,auVar241);
      fVar204 = auVar15._0_4_ + auVar18._0_4_;
      fVar205 = auVar15._4_4_ + auVar18._4_4_;
      fVar206 = auVar15._8_4_ + auVar18._8_4_;
      fVar219 = auVar15._12_4_ + auVar18._12_4_;
      fVar230 = auVar15._16_4_ + auVar18._16_4_;
      fVar246 = auVar15._20_4_ + auVar18._20_4_;
      fVar255 = auVar15._24_4_ + auVar18._24_4_;
      fVar143 = auVar18._28_4_;
      auVar34._4_4_ = auVar151._4_4_ * fVar152;
      auVar34._0_4_ = auVar151._0_4_ * fVar188;
      auVar34._8_4_ = auVar151._8_4_ * fVar189;
      auVar34._12_4_ = auVar151._12_4_ * fVar153;
      auVar34._16_4_ = auVar151._16_4_ * fVar190;
      auVar34._20_4_ = auVar151._20_4_ * fVar154;
      auVar34._24_4_ = auVar151._24_4_ * fVar191;
      auVar34._28_4_ = auVar151._28_4_;
      auVar35._4_4_ = local_98._4_4_ * fVar205;
      auVar35._0_4_ = local_98._0_4_ * fVar204;
      auVar35._8_4_ = local_98._8_4_ * fVar206;
      auVar35._12_4_ = local_98._12_4_ * fVar219;
      auVar35._16_4_ = local_98._16_4_ * fVar230;
      auVar35._20_4_ = local_98._20_4_ * fVar246;
      auVar35._24_4_ = local_98._24_4_ * fVar255;
      auVar35._28_4_ = local_98._28_4_;
      auVar18 = vsubps_avx(auVar34,auVar35);
      auVar36._4_4_ = fVar152 * fStack_f4;
      auVar36._0_4_ = fVar188 * local_f8;
      auVar36._8_4_ = fVar189 * fStack_f0;
      auVar36._12_4_ = fVar153 * fStack_ec;
      auVar36._16_4_ = fVar190 * fStack_e8;
      auVar36._20_4_ = fVar154 * fStack_e4;
      auVar36._24_4_ = fVar191 * fStack_e0;
      auVar36._28_4_ = auVar151._28_4_;
      auVar37._4_4_ = fVar205 * fStack_d4;
      auVar37._0_4_ = fVar204 * local_d8;
      auVar37._8_4_ = fVar206 * fStack_d0;
      auVar37._12_4_ = fVar219 * fStack_cc;
      auVar37._16_4_ = fVar230 * fStack_c8;
      auVar37._20_4_ = fVar246 * fStack_c4;
      auVar37._24_4_ = fVar255 * fStack_c0;
      auVar37._28_4_ = fVar143;
      auVar20 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar152 * fStack_4b4;
      auVar38._0_4_ = fVar188 * local_4b8;
      auVar38._8_4_ = fVar189 * fStack_4b0;
      auVar38._12_4_ = fVar153 * fStack_4ac;
      auVar38._16_4_ = fVar190 * fStack_4a8;
      auVar38._20_4_ = fVar154 * fStack_4a4;
      auVar38._24_4_ = fVar191 * fStack_4a0;
      auVar38._28_4_ = fVar143;
      auVar39._4_4_ = fVar205 * fStack_544;
      auVar39._0_4_ = fVar204 * local_548;
      auVar39._8_4_ = fVar206 * fStack_540;
      auVar39._12_4_ = fVar219 * fStack_53c;
      auVar39._16_4_ = fVar230 * fStack_538;
      auVar39._20_4_ = fVar246 * fStack_534;
      auVar39._24_4_ = fVar255 * fStack_530;
      auVar39._28_4_ = auVar14._28_4_;
      auVar85 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = local_b8._4_4_ * fVar152;
      auVar40._0_4_ = local_b8._0_4_ * fVar188;
      auVar40._8_4_ = local_b8._8_4_ * fVar189;
      auVar40._12_4_ = local_b8._12_4_ * fVar153;
      auVar40._16_4_ = local_b8._16_4_ * fVar190;
      auVar40._20_4_ = local_b8._20_4_ * fVar154;
      auVar40._24_4_ = local_b8._24_4_ * fVar191;
      auVar40._28_4_ = auVar14._28_4_;
      auVar41._4_4_ = local_3d8._4_4_ * fVar205;
      auVar41._0_4_ = local_3d8._0_4_ * fVar204;
      auVar41._8_4_ = local_3d8._8_4_ * fVar206;
      auVar41._12_4_ = local_3d8._12_4_ * fVar219;
      auVar41._16_4_ = local_3d8._16_4_ * fVar230;
      auVar41._20_4_ = local_3d8._20_4_ * fVar246;
      uVar4 = local_3d8._28_4_;
      auVar41._24_4_ = local_3d8._24_4_ * fVar255;
      auVar41._28_4_ = uVar4;
      auVar86 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = auVar241._4_4_ * fVar152;
      auVar42._0_4_ = auVar241._0_4_ * fVar188;
      auVar42._8_4_ = auVar241._8_4_ * fVar189;
      auVar42._12_4_ = auVar241._12_4_ * fVar153;
      auVar42._16_4_ = auVar241._16_4_ * fVar190;
      auVar42._20_4_ = auVar241._20_4_ * fVar154;
      auVar42._24_4_ = auVar241._24_4_ * fVar191;
      auVar42._28_4_ = uVar4;
      auVar43._4_4_ = auVar218._4_4_ * fVar205;
      auVar43._0_4_ = auVar218._0_4_ * fVar204;
      auVar43._8_4_ = auVar218._8_4_ * fVar206;
      auVar43._12_4_ = auVar218._12_4_ * fVar219;
      auVar43._16_4_ = auVar218._16_4_ * fVar230;
      auVar43._20_4_ = auVar218._20_4_ * fVar246;
      auVar43._24_4_ = auVar218._24_4_ * fVar255;
      auVar43._28_4_ = auVar218._28_4_;
      auVar21 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = fVar152 * fStack_134;
      auVar44._0_4_ = fVar188 * local_138;
      auVar44._8_4_ = fVar189 * fStack_130;
      auVar44._12_4_ = fVar153 * fStack_12c;
      auVar44._16_4_ = fVar190 * fStack_128;
      auVar44._20_4_ = fVar154 * fStack_124;
      auVar44._24_4_ = fVar191 * fStack_120;
      auVar44._28_4_ = uVar4;
      auVar45._4_4_ = fVar205 * fStack_114;
      auVar45._0_4_ = fVar204 * local_118;
      auVar45._8_4_ = fVar206 * fStack_110;
      auVar45._12_4_ = fVar219 * fStack_10c;
      auVar45._16_4_ = fVar230 * fStack_108;
      auVar45._20_4_ = fVar246 * fStack_104;
      auVar45._24_4_ = fVar255 * fStack_100;
      auVar45._28_4_ = auVar241._28_4_;
      auVar22 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar152 * auVar19._4_4_;
      auVar46._0_4_ = fVar188 * auVar19._0_4_;
      auVar46._8_4_ = fVar189 * auVar19._8_4_;
      auVar46._12_4_ = fVar153 * auVar19._12_4_;
      auVar46._16_4_ = fVar190 * auVar19._16_4_;
      auVar46._20_4_ = fVar154 * auVar19._20_4_;
      auVar46._24_4_ = fVar191 * auVar19._24_4_;
      auVar46._28_4_ = auVar241._28_4_;
      auVar47._4_4_ = fStack_4d4 * fVar205;
      auVar47._0_4_ = local_4d8 * fVar204;
      auVar47._8_4_ = fStack_4d0 * fVar206;
      auVar47._12_4_ = fStack_4cc * fVar219;
      auVar47._16_4_ = fStack_4c8 * fVar230;
      auVar47._20_4_ = fStack_4c4 * fVar246;
      auVar47._24_4_ = fStack_4c0 * fVar255;
      auVar47._28_4_ = local_b8._28_4_;
      auVar19 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = local_78._4_4_ * fVar152;
      auVar48._0_4_ = local_78._0_4_ * fVar188;
      auVar48._8_4_ = local_78._8_4_ * fVar189;
      auVar48._12_4_ = local_78._12_4_ * fVar153;
      auVar48._16_4_ = local_78._16_4_ * fVar190;
      auVar48._20_4_ = local_78._20_4_ * fVar154;
      auVar48._24_4_ = local_78._24_4_ * fVar191;
      auVar48._28_4_ = auVar16._28_4_ + auVar17._28_4_;
      auVar49._4_4_ = auVar84._4_4_ * fVar205;
      auVar49._0_4_ = auVar84._0_4_ * fVar204;
      auVar49._8_4_ = auVar84._8_4_ * fVar206;
      auVar49._12_4_ = auVar84._12_4_ * fVar219;
      auVar49._16_4_ = auVar84._16_4_ * fVar230;
      auVar49._20_4_ = auVar84._20_4_ * fVar246;
      auVar49._24_4_ = auVar84._24_4_ * fVar255;
      auVar49._28_4_ = auVar15._28_4_ + fVar143;
      auVar23 = vsubps_avx(auVar48,auVar49);
      auVar17 = vminps_avx(auVar18,auVar20);
      auVar16 = vmaxps_avx(auVar18,auVar20);
      auVar14 = vminps_avx(auVar85,auVar86);
      auVar14 = vminps_avx(auVar17,auVar14);
      auVar17 = vmaxps_avx(auVar85,auVar86);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar15 = vminps_avx(auVar21,auVar22);
      auVar17 = vmaxps_avx(auVar21,auVar22);
      auVar84 = vminps_avx(auVar19,auVar23);
      auVar15 = vminps_avx(auVar15,auVar84);
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar19,auVar23);
      auVar17 = vmaxps_avx(auVar17,auVar14);
      auVar17 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vcmpps_avx(auVar15,local_228,2);
      auVar17 = vcmpps_avx(auVar17,local_248,5);
      auVar16 = vandps_avx(auVar17,auVar16);
      auVar83 = vandps_avx(local_158,auVar83);
      auVar17 = auVar83 & auVar16;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') {
        auVar83 = vandps_avx(auVar16,auVar83);
        uVar59 = vmovmskps_avx(auVar83);
        if (uVar59 != 0) {
          uVar58 = (ulong)uVar60;
          auStack_3b8[uVar58] = uVar59 & 0xff;
          uVar5 = vmovlps_avx(auVar119);
          *(undefined8 *)(afStack_208 + uVar58 * 2) = uVar5;
          uVar56 = vmovlps_avx(auVar118);
          auStack_58[uVar58] = uVar56;
          uVar60 = uVar60 + 1;
        }
      }
    }
    if (uVar60 != 0) {
      do {
        uVar58 = (ulong)(uVar60 - 1);
        uVar59 = auStack_3b8[uVar58];
        fVar143 = afStack_208[uVar58 * 2];
        fVar188 = afStack_208[uVar58 * 2 + 1];
        auVar259._8_8_ = 0;
        auVar259._0_8_ = auStack_58[uVar58];
        auVar265 = ZEXT1664(auVar259);
        uVar56 = 0;
        if (uVar59 != 0) {
          for (; (uVar59 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
          }
        }
        uVar59 = uVar59 - 1 & uVar59;
        auStack_3b8[uVar58] = uVar59;
        if (uVar59 == 0) {
          uVar60 = uVar60 - 1;
        }
        fVar189 = (float)(uVar56 + 1) * 0.14285715;
        fVar152 = (1.0 - (float)uVar56 * 0.14285715) * fVar143 +
                  fVar188 * (float)uVar56 * 0.14285715;
        fVar143 = (1.0 - fVar189) * fVar143 + fVar188 * fVar189;
        fVar188 = fVar143 - fVar152;
        if (0.16666667 <= fVar188) {
          auVar70 = vinsertps_avx(ZEXT416((uint)fVar152),ZEXT416((uint)fVar143),0x10);
          auVar273 = ZEXT1664(auVar70);
          goto LAB_00e65b1a;
        }
        auVar70 = vshufps_avx(auVar259,auVar259,0x50);
        auVar95._8_4_ = 0x3f800000;
        auVar95._0_8_ = 0x3f8000003f800000;
        auVar95._12_4_ = 0x3f800000;
        auVar111 = vsubps_avx(auVar95,auVar70);
        fVar189 = auVar70._0_4_;
        fVar153 = auVar70._4_4_;
        fVar190 = auVar70._8_4_;
        fVar154 = auVar70._12_4_;
        fVar191 = auVar111._0_4_;
        fVar204 = auVar111._4_4_;
        fVar205 = auVar111._8_4_;
        fVar206 = auVar111._12_4_;
        auVar124._0_4_ = fVar189 * auVar283._0_4_ + fVar191 * fVar61;
        auVar124._4_4_ = fVar153 * auVar283._4_4_ + fVar204 * fVar89;
        auVar124._8_4_ = fVar190 * auVar283._0_4_ + fVar205 * fVar61;
        auVar124._12_4_ = fVar154 * auVar283._4_4_ + fVar206 * fVar89;
        auVar160._0_4_ = fVar189 * auVar249._0_4_ + fVar191 * fVar62;
        auVar160._4_4_ = fVar153 * auVar249._4_4_ + fVar204 * fVar90;
        auVar160._8_4_ = fVar190 * auVar249._0_4_ + fVar205 * fVar62;
        auVar160._12_4_ = fVar154 * auVar249._4_4_ + fVar206 * fVar90;
        auVar180._0_4_ = fVar189 * auVar94._0_4_ + auVar299._0_4_ * fVar191;
        auVar180._4_4_ = fVar153 * auVar94._4_4_ + auVar299._4_4_ * fVar204;
        auVar180._8_4_ = fVar190 * auVar94._0_4_ + auVar299._0_4_ * fVar205;
        auVar180._12_4_ = fVar154 * auVar94._4_4_ + auVar299._4_4_ * fVar206;
        auVar67._0_4_ = auVar65._0_4_ * fVar189 + auVar290._0_4_ * fVar191;
        auVar67._4_4_ = auVar65._4_4_ * fVar153 + auVar290._4_4_ * fVar204;
        auVar67._8_4_ = auVar65._0_4_ * fVar190 + auVar290._0_4_ * fVar205;
        auVar67._12_4_ = auVar65._4_4_ * fVar154 + auVar290._4_4_ * fVar206;
        auVar113._16_16_ = auVar124;
        auVar113._0_16_ = auVar124;
        auVar141._16_16_ = auVar160;
        auVar141._0_16_ = auVar160;
        auVar171._16_16_ = auVar180;
        auVar171._0_16_ = auVar180;
        auVar83 = ZEXT2032(CONCAT416(fVar143,ZEXT416((uint)fVar152)));
        auVar83 = vshufps_avx(auVar83,auVar83,0);
        auVar16 = vsubps_avx(auVar141,auVar113);
        fVar189 = auVar83._0_4_;
        fVar153 = auVar83._4_4_;
        fVar190 = auVar83._8_4_;
        fVar154 = auVar83._12_4_;
        fVar191 = auVar83._16_4_;
        fVar204 = auVar83._20_4_;
        fVar205 = auVar83._24_4_;
        auVar114._0_4_ = auVar124._0_4_ + auVar16._0_4_ * fVar189;
        auVar114._4_4_ = auVar124._4_4_ + auVar16._4_4_ * fVar153;
        auVar114._8_4_ = auVar124._8_4_ + auVar16._8_4_ * fVar190;
        auVar114._12_4_ = auVar124._12_4_ + auVar16._12_4_ * fVar154;
        auVar114._16_4_ = auVar124._0_4_ + auVar16._16_4_ * fVar191;
        auVar114._20_4_ = auVar124._4_4_ + auVar16._20_4_ * fVar204;
        auVar114._24_4_ = auVar124._8_4_ + auVar16._24_4_ * fVar205;
        auVar114._28_4_ = auVar124._12_4_ + auVar16._28_4_;
        auVar83 = vsubps_avx(auVar171,auVar141);
        auVar142._0_4_ = auVar160._0_4_ + auVar83._0_4_ * fVar189;
        auVar142._4_4_ = auVar160._4_4_ + auVar83._4_4_ * fVar153;
        auVar142._8_4_ = auVar160._8_4_ + auVar83._8_4_ * fVar190;
        auVar142._12_4_ = auVar160._12_4_ + auVar83._12_4_ * fVar154;
        auVar142._16_4_ = auVar160._0_4_ + auVar83._16_4_ * fVar191;
        auVar142._20_4_ = auVar160._4_4_ + auVar83._20_4_ * fVar204;
        auVar142._24_4_ = auVar160._8_4_ + auVar83._24_4_ * fVar205;
        auVar142._28_4_ = auVar160._12_4_ + auVar83._28_4_;
        auVar70 = vsubps_avx(auVar67,auVar180);
        auVar87._0_4_ = auVar180._0_4_ + auVar70._0_4_ * fVar189;
        auVar87._4_4_ = auVar180._4_4_ + auVar70._4_4_ * fVar153;
        auVar87._8_4_ = auVar180._8_4_ + auVar70._8_4_ * fVar190;
        auVar87._12_4_ = auVar180._12_4_ + auVar70._12_4_ * fVar154;
        auVar87._16_4_ = auVar180._0_4_ + auVar70._0_4_ * fVar191;
        auVar87._20_4_ = auVar180._4_4_ + auVar70._4_4_ * fVar204;
        auVar87._24_4_ = auVar180._8_4_ + auVar70._8_4_ * fVar205;
        auVar87._28_4_ = auVar180._12_4_ + auVar70._12_4_;
        auVar83 = vsubps_avx(auVar142,auVar114);
        auVar115._0_4_ = auVar114._0_4_ + fVar189 * auVar83._0_4_;
        auVar115._4_4_ = auVar114._4_4_ + fVar153 * auVar83._4_4_;
        auVar115._8_4_ = auVar114._8_4_ + fVar190 * auVar83._8_4_;
        auVar115._12_4_ = auVar114._12_4_ + fVar154 * auVar83._12_4_;
        auVar115._16_4_ = auVar114._16_4_ + fVar191 * auVar83._16_4_;
        auVar115._20_4_ = auVar114._20_4_ + fVar204 * auVar83._20_4_;
        auVar115._24_4_ = auVar114._24_4_ + fVar205 * auVar83._24_4_;
        auVar115._28_4_ = auVar114._28_4_ + auVar83._28_4_;
        auVar83 = vsubps_avx(auVar87,auVar142);
        auVar88._0_4_ = auVar142._0_4_ + fVar189 * auVar83._0_4_;
        auVar88._4_4_ = auVar142._4_4_ + fVar153 * auVar83._4_4_;
        auVar88._8_4_ = auVar142._8_4_ + fVar190 * auVar83._8_4_;
        auVar88._12_4_ = auVar142._12_4_ + fVar154 * auVar83._12_4_;
        auVar88._16_4_ = auVar142._16_4_ + fVar191 * auVar83._16_4_;
        auVar88._20_4_ = auVar142._20_4_ + fVar204 * auVar83._20_4_;
        auVar88._24_4_ = auVar142._24_4_ + fVar205 * auVar83._24_4_;
        auVar88._28_4_ = auVar142._28_4_ + auVar83._28_4_;
        auVar83 = vsubps_avx(auVar88,auVar115);
        auVar198._0_4_ = auVar115._0_4_ + fVar189 * auVar83._0_4_;
        auVar198._4_4_ = auVar115._4_4_ + fVar153 * auVar83._4_4_;
        auVar198._8_4_ = auVar115._8_4_ + fVar190 * auVar83._8_4_;
        auVar198._12_4_ = auVar115._12_4_ + fVar154 * auVar83._12_4_;
        auVar203._16_4_ = auVar115._16_4_ + fVar191 * auVar83._16_4_;
        auVar203._0_16_ = auVar198;
        auVar203._20_4_ = auVar115._20_4_ + fVar204 * auVar83._20_4_;
        auVar203._24_4_ = auVar115._24_4_ + fVar205 * auVar83._24_4_;
        auVar203._28_4_ = auVar115._28_4_ + auVar142._28_4_;
        auVar91 = auVar203._16_16_;
        auVar97 = vshufps_avx(ZEXT416((uint)(fVar188 * 0.33333334)),
                              ZEXT416((uint)(fVar188 * 0.33333334)),0);
        auVar161._0_4_ = auVar198._0_4_ + auVar97._0_4_ * auVar83._0_4_ * 3.0;
        auVar161._4_4_ = auVar198._4_4_ + auVar97._4_4_ * auVar83._4_4_ * 3.0;
        auVar161._8_4_ = auVar198._8_4_ + auVar97._8_4_ * auVar83._8_4_ * 3.0;
        auVar161._12_4_ = auVar198._12_4_ + auVar97._12_4_ * auVar83._12_4_ * 3.0;
        auVar140 = vshufpd_avx(auVar198,auVar198,3);
        auVar64 = vshufpd_avx(auVar91,auVar91,3);
        _local_3d8 = auVar140;
        auVar70 = vsubps_avx(auVar140,auVar198);
        auVar111 = vsubps_avx(auVar64,auVar91);
        auVar68._0_4_ = auVar70._0_4_ + auVar111._0_4_;
        auVar68._4_4_ = auVar70._4_4_ + auVar111._4_4_;
        auVar68._8_4_ = auVar70._8_4_ + auVar111._8_4_;
        auVar68._12_4_ = auVar70._12_4_ + auVar111._12_4_;
        auVar70 = vmovshdup_avx(auVar198);
        auVar111 = vmovshdup_avx(auVar161);
        auVar126 = vshufps_avx(auVar68,auVar68,0);
        auVar63 = vshufps_avx(auVar68,auVar68,0x55);
        fVar189 = auVar63._0_4_;
        fVar153 = auVar63._4_4_;
        fVar190 = auVar63._8_4_;
        fVar154 = auVar63._12_4_;
        fVar191 = auVar126._0_4_;
        fVar204 = auVar126._4_4_;
        fVar205 = auVar126._8_4_;
        fVar206 = auVar126._12_4_;
        auVar69._0_4_ = fVar191 * auVar198._0_4_ + auVar70._0_4_ * fVar189;
        auVar69._4_4_ = fVar204 * auVar198._4_4_ + auVar70._4_4_ * fVar153;
        auVar69._8_4_ = fVar205 * auVar198._8_4_ + auVar70._8_4_ * fVar190;
        auVar69._12_4_ = fVar206 * auVar198._12_4_ + auVar70._12_4_ * fVar154;
        auVar260._0_4_ = fVar191 * auVar161._0_4_ + auVar111._0_4_ * fVar189;
        auVar260._4_4_ = fVar204 * auVar161._4_4_ + auVar111._4_4_ * fVar153;
        auVar260._8_4_ = fVar205 * auVar161._8_4_ + auVar111._8_4_ * fVar190;
        auVar260._12_4_ = fVar206 * auVar161._12_4_ + auVar111._12_4_ * fVar154;
        auVar111 = vshufps_avx(auVar69,auVar69,0xe8);
        auVar126 = vshufps_avx(auVar260,auVar260,0xe8);
        auVar70 = vcmpps_avx(auVar111,auVar126,1);
        uVar59 = vextractps_avx(auVar70,0);
        auVar63 = auVar260;
        if ((uVar59 & 1) == 0) {
          auVar63 = auVar69;
        }
        auVar96._0_4_ = auVar97._0_4_ * auVar83._16_4_ * 3.0;
        auVar96._4_4_ = auVar97._4_4_ * auVar83._20_4_ * 3.0;
        auVar96._8_4_ = auVar97._8_4_ * auVar83._24_4_ * 3.0;
        auVar96._12_4_ = auVar97._12_4_ * 0.0;
        auVar116 = vsubps_avx(auVar91,auVar96);
        auVar97 = vmovshdup_avx(auVar116);
        auVar91 = vmovshdup_avx(auVar91);
        fVar219 = auVar116._0_4_;
        fVar230 = auVar116._4_4_;
        auVar181._0_4_ = fVar219 * fVar191 + auVar97._0_4_ * fVar189;
        auVar181._4_4_ = fVar230 * fVar204 + auVar97._4_4_ * fVar153;
        auVar181._8_4_ = auVar116._8_4_ * fVar205 + auVar97._8_4_ * fVar190;
        auVar181._12_4_ = auVar116._12_4_ * fVar206 + auVar97._12_4_ * fVar154;
        auVar300._0_4_ = fVar191 * auVar203._16_4_ + auVar91._0_4_ * fVar189;
        auVar300._4_4_ = fVar204 * auVar203._20_4_ + auVar91._4_4_ * fVar153;
        auVar300._8_4_ = fVar205 * auVar203._24_4_ + auVar91._8_4_ * fVar190;
        auVar300._12_4_ = fVar206 * auVar203._28_4_ + auVar91._12_4_ * fVar154;
        auVar91 = vshufps_avx(auVar181,auVar181,0xe8);
        auVar117 = vshufps_avx(auVar300,auVar300,0xe8);
        auVar97 = vcmpps_avx(auVar91,auVar117,1);
        uVar59 = vextractps_avx(auVar97,0);
        auVar118 = auVar300;
        if ((uVar59 & 1) == 0) {
          auVar118 = auVar181;
        }
        auVar63 = vmaxss_avx(auVar118,auVar63);
        auVar111 = vminps_avx(auVar111,auVar126);
        auVar126 = vminps_avx(auVar91,auVar117);
        auVar126 = vminps_avx(auVar111,auVar126);
        auVar70 = vshufps_avx(auVar70,auVar70,0x55);
        auVar70 = vblendps_avx(auVar70,auVar97,2);
        auVar97 = vpslld_avx(auVar70,0x1f);
        auVar70 = vshufpd_avx(auVar260,auVar260,1);
        auVar70 = vinsertps_avx(auVar70,auVar300,0x9c);
        auVar111 = vshufpd_avx(auVar69,auVar69,1);
        auVar111 = vinsertps_avx(auVar111,auVar181,0x9c);
        auVar70 = vblendvps_avx(auVar111,auVar70,auVar97);
        auVar111 = vmovshdup_avx(auVar70);
        auVar70 = vmaxss_avx(auVar111,auVar70);
        fVar190 = auVar126._0_4_;
        auVar111 = vmovshdup_avx(auVar126);
        fVar153 = auVar70._0_4_;
        fVar154 = auVar111._0_4_;
        fVar189 = auVar63._0_4_;
        if ((0.0001 <= fVar190) || (fVar153 <= -0.0001)) {
          if ((fVar154 < 0.0001 && -0.0001 < fVar189) || (fVar190 < 0.0001 && -0.0001 < fVar189))
          goto LAB_00e6651b;
          auVar97 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar70,1);
          auVar111 = vcmpps_avx(auVar111,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar111 = vandps_avx(auVar111,auVar97);
          if ((auVar111 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_00e6651b;
        }
        else {
LAB_00e6651b:
          auVar97 = vcmpps_avx(auVar126,_DAT_01f7aa10,1);
          auVar111 = vcmpss_avx(auVar63,ZEXT416(0) << 0x20,1);
          auVar125._8_4_ = 0x3f800000;
          auVar125._0_8_ = 0x3f8000003f800000;
          auVar125._12_4_ = 0x3f800000;
          auVar162._8_4_ = 0xbf800000;
          auVar162._0_8_ = 0xbf800000bf800000;
          auVar162._12_4_ = 0xbf800000;
          auVar111 = vblendvps_avx(auVar125,auVar162,auVar111);
          auVar97 = vblendvps_avx(auVar125,auVar162,auVar97);
          auVar126 = vcmpss_avx(auVar97,auVar111,4);
          auVar126 = vpshufd_avx(ZEXT416(auVar126._0_4_ & 1),0x50);
          auVar126 = vpslld_avx(auVar126,0x1f);
          auVar126 = vpsrad_avx(auVar126,0x1f);
          auVar126 = vpandn_avx(auVar126,_DAT_01fafeb0);
          auVar63 = vmovshdup_avx(auVar97);
          fVar191 = auVar63._0_4_;
          if ((auVar97._0_4_ != fVar191) || (NAN(auVar97._0_4_) || NAN(fVar191))) {
            if ((fVar154 != fVar190) || (NAN(fVar154) || NAN(fVar190))) {
              fVar190 = -fVar190 / (fVar154 - fVar190);
              auVar97 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar190) * 0.0 + fVar190)));
            }
            else {
              auVar97 = ZEXT816(0x3f80000000000000);
              if ((fVar190 != 0.0) || (NAN(fVar190))) {
                auVar97 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar91 = vcmpps_avx(auVar126,auVar97,1);
            auVar63 = vblendps_avx(auVar126,auVar97,2);
            auVar97 = vblendps_avx(auVar97,auVar126,2);
            auVar126 = vblendvps_avx(auVar97,auVar63,auVar91);
          }
          auVar70 = vcmpss_avx(auVar70,ZEXT416(0) << 0x20,1);
          auVar127._8_4_ = 0x3f800000;
          auVar127._0_8_ = 0x3f8000003f800000;
          auVar127._12_4_ = 0x3f800000;
          auVar163._8_4_ = 0xbf800000;
          auVar163._0_8_ = 0xbf800000bf800000;
          auVar163._12_4_ = 0xbf800000;
          auVar70 = vblendvps_avx(auVar127,auVar163,auVar70);
          fVar190 = auVar70._0_4_;
          if ((auVar111._0_4_ != fVar190) || (NAN(auVar111._0_4_) || NAN(fVar190))) {
            if ((fVar153 != fVar189) || (NAN(fVar153) || NAN(fVar189))) {
              fVar189 = -fVar189 / (fVar153 - fVar189);
              auVar70 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar189) * 0.0 + fVar189)));
            }
            else {
              auVar70 = ZEXT816(0x3f80000000000000);
              if ((fVar189 != 0.0) || (NAN(fVar189))) {
                auVar70 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar97 = vcmpps_avx(auVar126,auVar70,1);
            auVar111 = vblendps_avx(auVar126,auVar70,2);
            auVar70 = vblendps_avx(auVar70,auVar126,2);
            auVar126 = vblendvps_avx(auVar70,auVar111,auVar97);
          }
          if ((fVar191 != fVar190) || (NAN(fVar191) || NAN(fVar190))) {
            auVar71._8_4_ = 0x3f800000;
            auVar71._0_8_ = 0x3f8000003f800000;
            auVar71._12_4_ = 0x3f800000;
            auVar70 = vcmpps_avx(auVar126,auVar71,1);
            auVar111 = vinsertps_avx(auVar126,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar128._4_12_ = auVar126._4_12_;
            auVar128._0_4_ = 0x3f800000;
            auVar126 = vblendvps_avx(auVar128,auVar111,auVar70);
          }
          auVar70 = vcmpps_avx(auVar126,_DAT_01f7b6f0,1);
          auVar51._12_4_ = 0;
          auVar51._0_12_ = auVar126._4_12_;
          auVar111 = vinsertps_avx(auVar126,ZEXT416(0x3f800000),0x10);
          auVar70 = vblendvps_avx(auVar111,auVar51 << 0x20,auVar70);
          auVar111 = vmovshdup_avx(auVar70);
          if (auVar70._0_4_ <= auVar111._0_4_) {
            auVar72._0_4_ = auVar70._0_4_ + -0.1;
            auVar72._4_4_ = auVar70._4_4_ + 0.1;
            auVar72._8_4_ = auVar70._8_4_ + 0.0;
            auVar72._12_4_ = auVar70._12_4_ + 0.0;
            auVar97 = vshufpd_avx(auVar161,auVar161,3);
            auVar199._8_8_ = 0x3f80000000000000;
            auVar199._0_8_ = 0x3f80000000000000;
            auVar70 = vcmpps_avx(auVar72,auVar199,1);
            auVar50._12_4_ = 0;
            auVar50._0_12_ = auVar72._4_12_;
            auVar111 = vinsertps_avx(auVar72,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar70 = vblendvps_avx(auVar111,auVar50 << 0x20,auVar70);
            auVar111 = vshufpd_avx(auVar116,auVar116,3);
            auVar126 = vshufps_avx(auVar70,auVar70,0x50);
            auVar200._8_4_ = 0x3f800000;
            auVar200._0_8_ = 0x3f8000003f800000;
            auVar200._12_4_ = 0x3f800000;
            auVar63 = vsubps_avx(auVar200,auVar126);
            local_3d8._0_4_ = auVar140._0_4_;
            local_3d8._4_4_ = auVar140._4_4_;
            fStack_3d0 = auVar140._8_4_;
            fStack_3cc = auVar140._12_4_;
            fVar189 = auVar126._0_4_;
            fVar153 = auVar126._4_4_;
            fVar190 = auVar126._8_4_;
            fVar154 = auVar126._12_4_;
            local_588 = auVar64._0_4_;
            fStack_584 = auVar64._4_4_;
            fStack_580 = auVar64._8_4_;
            fStack_57c = auVar64._12_4_;
            fVar191 = auVar63._0_4_;
            fVar204 = auVar63._4_4_;
            fVar205 = auVar63._8_4_;
            fVar206 = auVar63._12_4_;
            auVar73._0_4_ = fVar189 * (float)local_3d8._0_4_ + fVar191 * auVar198._0_4_;
            auVar73._4_4_ = fVar153 * (float)local_3d8._4_4_ + fVar204 * auVar198._4_4_;
            auVar73._8_4_ = fVar190 * fStack_3d0 + fVar205 * auVar198._0_4_;
            auVar73._12_4_ = fVar154 * fStack_3cc + fVar206 * auVar198._4_4_;
            auVar182._0_4_ = auVar97._0_4_ * fVar189 + fVar191 * auVar161._0_4_;
            auVar182._4_4_ = auVar97._4_4_ * fVar153 + fVar204 * auVar161._4_4_;
            auVar182._8_4_ = auVar97._8_4_ * fVar190 + fVar205 * auVar161._0_4_;
            auVar182._12_4_ = auVar97._12_4_ * fVar154 + fVar206 * auVar161._4_4_;
            auVar216._0_4_ = auVar111._0_4_ * fVar189 + fVar191 * fVar219;
            auVar216._4_4_ = auVar111._4_4_ * fVar153 + fVar204 * fVar230;
            auVar216._8_4_ = auVar111._8_4_ * fVar190 + fVar205 * fVar219;
            auVar216._12_4_ = auVar111._12_4_ * fVar154 + fVar206 * fVar230;
            auVar250._0_4_ = fVar189 * local_588 + fVar191 * auVar203._16_4_;
            auVar250._4_4_ = fVar153 * fStack_584 + fVar204 * auVar203._20_4_;
            auVar250._8_4_ = fVar190 * fStack_580 + fVar205 * auVar203._16_4_;
            auVar250._12_4_ = fVar154 * fStack_57c + fVar206 * auVar203._20_4_;
            auVar64 = vsubps_avx(auVar200,auVar70);
            auVar111 = vmovshdup_avx(auVar259);
            auVar140 = vmovsldup_avx(auVar259);
            auVar201._0_4_ = auVar64._0_4_ * auVar140._0_4_ + auVar70._0_4_ * auVar111._0_4_;
            auVar201._4_4_ = auVar64._4_4_ * auVar140._4_4_ + auVar70._4_4_ * auVar111._4_4_;
            auVar201._8_4_ = auVar64._8_4_ * auVar140._8_4_ + auVar70._8_4_ * auVar111._8_4_;
            auVar201._12_4_ = auVar64._12_4_ * auVar140._12_4_ + auVar70._12_4_ * auVar111._12_4_;
            auVar116 = vmovshdup_avx(auVar201);
            auVar70 = vsubps_avx(auVar182,auVar73);
            auVar129._0_4_ = auVar70._0_4_ * 3.0;
            auVar129._4_4_ = auVar70._4_4_ * 3.0;
            auVar129._8_4_ = auVar70._8_4_ * 3.0;
            auVar129._12_4_ = auVar70._12_4_ * 3.0;
            auVar70 = vsubps_avx(auVar216,auVar182);
            auVar148._0_4_ = auVar70._0_4_ * 3.0;
            auVar148._4_4_ = auVar70._4_4_ * 3.0;
            auVar148._8_4_ = auVar70._8_4_ * 3.0;
            auVar148._12_4_ = auVar70._12_4_ * 3.0;
            auVar70 = vsubps_avx(auVar250,auVar216);
            auVar226._0_4_ = auVar70._0_4_ * 3.0;
            auVar226._4_4_ = auVar70._4_4_ * 3.0;
            auVar226._8_4_ = auVar70._8_4_ * 3.0;
            auVar226._12_4_ = auVar70._12_4_ * 3.0;
            auVar111 = vminps_avx(auVar148,auVar226);
            auVar70 = vmaxps_avx(auVar148,auVar226);
            auVar111 = vminps_avx(auVar129,auVar111);
            auVar70 = vmaxps_avx(auVar129,auVar70);
            auVar140 = vshufpd_avx(auVar111,auVar111,3);
            auVar64 = vshufpd_avx(auVar70,auVar70,3);
            auVar111 = vminps_avx(auVar111,auVar140);
            auVar70 = vmaxps_avx(auVar70,auVar64);
            auVar140 = vshufps_avx(ZEXT416((uint)(1.0 / fVar188)),ZEXT416((uint)(1.0 / fVar188)),0);
            auVar227._0_4_ = auVar140._0_4_ * auVar111._0_4_;
            auVar227._4_4_ = auVar140._4_4_ * auVar111._4_4_;
            auVar227._8_4_ = auVar140._8_4_ * auVar111._8_4_;
            auVar227._12_4_ = auVar140._12_4_ * auVar111._12_4_;
            auVar237._0_4_ = auVar140._0_4_ * auVar70._0_4_;
            auVar237._4_4_ = auVar140._4_4_ * auVar70._4_4_;
            auVar237._8_4_ = auVar140._8_4_ * auVar70._8_4_;
            auVar237._12_4_ = auVar140._12_4_ * auVar70._12_4_;
            auVar63 = ZEXT416((uint)(1.0 / (auVar116._0_4_ - auVar201._0_4_)));
            auVar70 = vshufpd_avx(auVar73,auVar73,3);
            auVar111 = vshufpd_avx(auVar182,auVar182,3);
            auVar140 = vshufpd_avx(auVar216,auVar216,3);
            auVar64 = vshufpd_avx(auVar250,auVar250,3);
            auVar70 = vsubps_avx(auVar70,auVar73);
            auVar97 = vsubps_avx(auVar111,auVar182);
            auVar126 = vsubps_avx(auVar140,auVar216);
            auVar64 = vsubps_avx(auVar64,auVar250);
            auVar111 = vminps_avx(auVar70,auVar97);
            auVar70 = vmaxps_avx(auVar70,auVar97);
            auVar140 = vminps_avx(auVar126,auVar64);
            auVar140 = vminps_avx(auVar111,auVar140);
            auVar111 = vmaxps_avx(auVar126,auVar64);
            auVar70 = vmaxps_avx(auVar70,auVar111);
            auVar111 = vshufps_avx(auVar63,auVar63,0);
            auVar284._0_4_ = auVar111._0_4_ * auVar140._0_4_;
            auVar284._4_4_ = auVar111._4_4_ * auVar140._4_4_;
            auVar284._8_4_ = auVar111._8_4_ * auVar140._8_4_;
            auVar284._12_4_ = auVar111._12_4_ * auVar140._12_4_;
            auVar292._0_4_ = auVar111._0_4_ * auVar70._0_4_;
            auVar292._4_4_ = auVar111._4_4_ * auVar70._4_4_;
            auVar292._8_4_ = auVar111._8_4_ * auVar70._8_4_;
            auVar292._12_4_ = auVar111._12_4_ * auVar70._12_4_;
            auVar70 = vmovsldup_avx(auVar201);
            auVar251._4_12_ = auVar70._4_12_;
            auVar251._0_4_ = fVar152;
            auVar261._4_12_ = auVar201._4_12_;
            auVar261._0_4_ = fVar143;
            auVar149._0_4_ = (fVar152 + fVar143) * 0.5;
            auVar149._4_4_ = (auVar70._4_4_ + auVar201._4_4_) * 0.5;
            auVar149._8_4_ = (auVar70._8_4_ + auVar201._8_4_) * 0.5;
            auVar149._12_4_ = (auVar70._12_4_ + auVar201._12_4_) * 0.5;
            auVar70 = vshufps_avx(auVar149,auVar149,0);
            fVar189 = auVar70._0_4_;
            fVar153 = auVar70._4_4_;
            fVar190 = auVar70._8_4_;
            fVar154 = auVar70._12_4_;
            local_558 = auVar11._0_4_;
            fStack_554 = auVar11._4_4_;
            fStack_550 = auVar11._8_4_;
            fStack_54c = auVar11._12_4_;
            auVar98._0_4_ = fVar189 * (float)local_278._0_4_ + local_558;
            auVar98._4_4_ = fVar153 * (float)local_278._4_4_ + fStack_554;
            auVar98._8_4_ = fVar190 * fStack_270 + fStack_550;
            auVar98._12_4_ = fVar154 * fStack_26c + fStack_54c;
            local_5e8._0_4_ = auVar12._0_4_;
            local_5e8._4_4_ = auVar12._4_4_;
            fStack_5e0 = auVar12._8_4_;
            fStack_5dc = auVar12._12_4_;
            auVar130._0_4_ = fVar189 * (float)local_288._0_4_ + (float)local_5e8._0_4_;
            auVar130._4_4_ = fVar153 * (float)local_288._4_4_ + (float)local_5e8._4_4_;
            auVar130._8_4_ = fVar190 * fStack_280 + fStack_5e0;
            auVar130._12_4_ = fVar154 * fStack_27c + fStack_5dc;
            local_568._0_4_ = auVar13._0_4_;
            local_568._4_4_ = auVar13._4_4_;
            fStack_560 = auVar13._8_4_;
            fStack_55c = auVar13._12_4_;
            auVar183._0_4_ = fVar189 * (float)local_298._0_4_ + (float)local_568._0_4_;
            auVar183._4_4_ = fVar153 * (float)local_298._4_4_ + (float)local_568._4_4_;
            auVar183._8_4_ = fVar190 * fStack_290 + fStack_560;
            auVar183._12_4_ = fVar154 * fStack_28c + fStack_55c;
            auVar70 = vsubps_avx(auVar130,auVar98);
            auVar99._0_4_ = auVar98._0_4_ + fVar189 * auVar70._0_4_;
            auVar99._4_4_ = auVar98._4_4_ + fVar153 * auVar70._4_4_;
            auVar99._8_4_ = auVar98._8_4_ + fVar190 * auVar70._8_4_;
            auVar99._12_4_ = auVar98._12_4_ + fVar154 * auVar70._12_4_;
            auVar70 = vsubps_avx(auVar183,auVar130);
            auVar131._0_4_ = auVar130._0_4_ + fVar189 * auVar70._0_4_;
            auVar131._4_4_ = auVar130._4_4_ + fVar153 * auVar70._4_4_;
            auVar131._8_4_ = auVar130._8_4_ + fVar190 * auVar70._8_4_;
            auVar131._12_4_ = auVar130._12_4_ + fVar154 * auVar70._12_4_;
            auVar70 = vsubps_avx(auVar131,auVar99);
            fVar189 = auVar99._0_4_ + fVar189 * auVar70._0_4_;
            fVar153 = auVar99._4_4_ + fVar153 * auVar70._4_4_;
            auVar74._0_8_ = CONCAT44(fVar153,fVar189);
            auVar74._8_4_ = auVar99._8_4_ + fVar190 * auVar70._8_4_;
            auVar74._12_4_ = auVar99._12_4_ + fVar154 * auVar70._12_4_;
            fVar190 = auVar70._0_4_ * 3.0;
            fVar154 = auVar70._4_4_ * 3.0;
            auVar100._0_8_ = CONCAT44(fVar154,fVar190);
            auVar100._8_4_ = auVar70._8_4_ * 3.0;
            auVar100._12_4_ = auVar70._12_4_ * 3.0;
            auVar132._8_8_ = auVar74._0_8_;
            auVar132._0_8_ = auVar74._0_8_;
            auVar70 = vshufpd_avx(auVar74,auVar74,3);
            auVar111 = vshufps_avx(auVar149,auVar149,0x55);
            auVar126 = vsubps_avx(auVar70,auVar132);
            auVar271._0_4_ = auVar126._0_4_ * auVar111._0_4_ + fVar189;
            auVar271._4_4_ = auVar126._4_4_ * auVar111._4_4_ + fVar153;
            auVar271._8_4_ = auVar126._8_4_ * auVar111._8_4_ + fVar189;
            auVar271._12_4_ = auVar126._12_4_ * auVar111._12_4_ + fVar153;
            auVar133._8_8_ = auVar100._0_8_;
            auVar133._0_8_ = auVar100._0_8_;
            auVar70 = vshufpd_avx(auVar100,auVar100,1);
            auVar70 = vsubps_avx(auVar70,auVar133);
            auVar101._0_4_ = auVar70._0_4_ * auVar111._0_4_ + fVar190;
            auVar101._4_4_ = auVar70._4_4_ * auVar111._4_4_ + fVar154;
            auVar101._8_4_ = auVar70._8_4_ * auVar111._8_4_ + fVar190;
            auVar101._12_4_ = auVar70._12_4_ * auVar111._12_4_ + fVar154;
            auVar111 = vmovshdup_avx(auVar101);
            auVar184._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
            auVar184._8_4_ = auVar111._8_4_ ^ 0x80000000;
            auVar184._12_4_ = auVar111._12_4_ ^ 0x80000000;
            auVar140 = vmovshdup_avx(auVar126);
            auVar70 = vunpcklps_avx(auVar140,auVar184);
            auVar64 = vshufps_avx(auVar70,auVar184,4);
            auVar75._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
            auVar75._8_4_ = -auVar126._8_4_;
            auVar75._12_4_ = -auVar126._12_4_;
            auVar70 = vmovlhps_avx(auVar75,auVar101);
            auVar97 = vshufps_avx(auVar70,auVar101,8);
            auVar70 = ZEXT416((uint)(auVar101._0_4_ * auVar140._0_4_ -
                                    auVar126._0_4_ * auVar111._0_4_));
            auVar111 = vshufps_avx(auVar70,auVar70,0);
            auVar70 = vdivps_avx(auVar64,auVar111);
            auVar111 = vdivps_avx(auVar97,auVar111);
            auVar97 = vinsertps_avx(auVar227,auVar284,0x1c);
            auVar126 = vinsertps_avx(auVar237,auVar292,0x1c);
            auVar63 = vinsertps_avx(auVar284,auVar227,0x4c);
            auVar91 = vinsertps_avx(auVar292,auVar237,0x4c);
            auVar140 = vmovsldup_avx(auVar70);
            auVar134._0_4_ = auVar140._0_4_ * auVar97._0_4_;
            auVar134._4_4_ = auVar140._4_4_ * auVar97._4_4_;
            auVar134._8_4_ = auVar140._8_4_ * auVar97._8_4_;
            auVar134._12_4_ = auVar140._12_4_ * auVar97._12_4_;
            auVar102._0_4_ = auVar126._0_4_ * auVar140._0_4_;
            auVar102._4_4_ = auVar126._4_4_ * auVar140._4_4_;
            auVar102._8_4_ = auVar126._8_4_ * auVar140._8_4_;
            auVar102._12_4_ = auVar126._12_4_ * auVar140._12_4_;
            auVar64 = vminps_avx(auVar134,auVar102);
            auVar140 = vmaxps_avx(auVar102,auVar134);
            auVar117 = vmovsldup_avx(auVar111);
            auVar293._0_4_ = auVar63._0_4_ * auVar117._0_4_;
            auVar293._4_4_ = auVar63._4_4_ * auVar117._4_4_;
            auVar293._8_4_ = auVar63._8_4_ * auVar117._8_4_;
            auVar293._12_4_ = auVar63._12_4_ * auVar117._12_4_;
            auVar135._0_4_ = auVar91._0_4_ * auVar117._0_4_;
            auVar135._4_4_ = auVar91._4_4_ * auVar117._4_4_;
            auVar135._8_4_ = auVar91._8_4_ * auVar117._8_4_;
            auVar135._12_4_ = auVar91._12_4_ * auVar117._12_4_;
            auVar117 = vminps_avx(auVar293,auVar135);
            auVar164._0_4_ = auVar64._0_4_ + auVar117._0_4_;
            auVar164._4_4_ = auVar64._4_4_ + auVar117._4_4_;
            auVar164._8_4_ = auVar64._8_4_ + auVar117._8_4_;
            auVar164._12_4_ = auVar64._12_4_ + auVar117._12_4_;
            auVar64 = vmaxps_avx(auVar135,auVar293);
            auVar117 = vsubps_avx(auVar251,auVar149);
            auVar118 = vsubps_avx(auVar261,auVar149);
            auVar103._0_4_ = auVar140._0_4_ + auVar64._0_4_;
            auVar103._4_4_ = auVar140._4_4_ + auVar64._4_4_;
            auVar103._8_4_ = auVar140._8_4_ + auVar64._8_4_;
            auVar103._12_4_ = auVar140._12_4_ + auVar64._12_4_;
            auVar136._8_8_ = 0x3f800000;
            auVar136._0_8_ = 0x3f800000;
            auVar140 = vsubps_avx(auVar136,auVar103);
            auVar64 = vsubps_avx(auVar136,auVar164);
            fVar205 = auVar117._0_4_;
            auVar165._0_4_ = fVar205 * auVar140._0_4_;
            fVar206 = auVar117._4_4_;
            auVar165._4_4_ = fVar206 * auVar140._4_4_;
            fVar219 = auVar117._8_4_;
            auVar165._8_4_ = fVar219 * auVar140._8_4_;
            fVar230 = auVar117._12_4_;
            auVar165._12_4_ = fVar230 * auVar140._12_4_;
            fVar190 = auVar118._0_4_;
            auVar104._0_4_ = fVar190 * auVar140._0_4_;
            fVar154 = auVar118._4_4_;
            auVar104._4_4_ = fVar154 * auVar140._4_4_;
            fVar191 = auVar118._8_4_;
            auVar104._8_4_ = fVar191 * auVar140._8_4_;
            fVar204 = auVar118._12_4_;
            auVar104._12_4_ = fVar204 * auVar140._12_4_;
            auVar262._0_4_ = fVar205 * auVar64._0_4_;
            auVar262._4_4_ = fVar206 * auVar64._4_4_;
            auVar262._8_4_ = fVar219 * auVar64._8_4_;
            auVar262._12_4_ = fVar230 * auVar64._12_4_;
            auVar137._0_4_ = fVar190 * auVar64._0_4_;
            auVar137._4_4_ = fVar154 * auVar64._4_4_;
            auVar137._8_4_ = fVar191 * auVar64._8_4_;
            auVar137._12_4_ = fVar204 * auVar64._12_4_;
            auVar140 = vminps_avx(auVar165,auVar262);
            auVar64 = vminps_avx(auVar104,auVar137);
            auVar117 = vminps_avx(auVar140,auVar64);
            auVar140 = vmaxps_avx(auVar262,auVar165);
            auVar64 = vmaxps_avx(auVar137,auVar104);
            auVar118 = vshufps_avx(auVar149,auVar149,0x54);
            auVar64 = vmaxps_avx(auVar64,auVar140);
            auVar119 = vshufps_avx(auVar271,auVar271,0);
            auVar144 = vshufps_avx(auVar271,auVar271,0x55);
            auVar140 = vhaddps_avx(auVar117,auVar117);
            auVar64 = vhaddps_avx(auVar64,auVar64);
            auVar150._0_4_ = auVar119._0_4_ * auVar70._0_4_ + auVar144._0_4_ * auVar111._0_4_;
            auVar150._4_4_ = auVar119._4_4_ * auVar70._4_4_ + auVar144._4_4_ * auVar111._4_4_;
            auVar150._8_4_ = auVar119._8_4_ * auVar70._8_4_ + auVar144._8_4_ * auVar111._8_4_;
            auVar150._12_4_ = auVar119._12_4_ * auVar70._12_4_ + auVar144._12_4_ * auVar111._12_4_;
            auVar117 = vsubps_avx(auVar118,auVar150);
            fVar189 = auVar117._0_4_ + auVar140._0_4_;
            fVar153 = auVar117._0_4_ + auVar64._0_4_;
            auVar140 = vmaxss_avx(ZEXT416((uint)fVar152),ZEXT416((uint)fVar189));
            auVar64 = vminss_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar143));
            if (auVar140._0_4_ <= auVar64._0_4_) {
              auVar140 = vmovshdup_avx(auVar70);
              auVar76._0_4_ = auVar140._0_4_ * auVar97._0_4_;
              auVar76._4_4_ = auVar140._4_4_ * auVar97._4_4_;
              auVar76._8_4_ = auVar140._8_4_ * auVar97._8_4_;
              auVar76._12_4_ = auVar140._12_4_ * auVar97._12_4_;
              auVar105._0_4_ = auVar126._0_4_ * auVar140._0_4_;
              auVar105._4_4_ = auVar126._4_4_ * auVar140._4_4_;
              auVar105._8_4_ = auVar126._8_4_ * auVar140._8_4_;
              auVar105._12_4_ = auVar126._12_4_ * auVar140._12_4_;
              auVar64 = vminps_avx(auVar76,auVar105);
              auVar140 = vmaxps_avx(auVar105,auVar76);
              auVar97 = vmovshdup_avx(auVar111);
              auVar166._0_4_ = auVar63._0_4_ * auVar97._0_4_;
              auVar166._4_4_ = auVar63._4_4_ * auVar97._4_4_;
              auVar166._8_4_ = auVar63._8_4_ * auVar97._8_4_;
              auVar166._12_4_ = auVar63._12_4_ * auVar97._12_4_;
              auVar106._0_4_ = auVar91._0_4_ * auVar97._0_4_;
              auVar106._4_4_ = auVar91._4_4_ * auVar97._4_4_;
              auVar106._8_4_ = auVar91._8_4_ * auVar97._8_4_;
              auVar106._12_4_ = auVar91._12_4_ * auVar97._12_4_;
              auVar97 = vminps_avx(auVar166,auVar106);
              auVar138._0_4_ = auVar64._0_4_ + auVar97._0_4_;
              auVar138._4_4_ = auVar64._4_4_ + auVar97._4_4_;
              auVar138._8_4_ = auVar64._8_4_ + auVar97._8_4_;
              auVar138._12_4_ = auVar64._12_4_ + auVar97._12_4_;
              auVar64 = vmaxps_avx(auVar106,auVar166);
              auVar77._0_4_ = auVar140._0_4_ + auVar64._0_4_;
              auVar77._4_4_ = auVar140._4_4_ + auVar64._4_4_;
              auVar77._8_4_ = auVar140._8_4_ + auVar64._8_4_;
              auVar77._12_4_ = auVar140._12_4_ + auVar64._12_4_;
              auVar140 = vsubps_avx(auVar199,auVar77);
              auVar64 = vsubps_avx(auVar199,auVar138);
              auVar139._0_4_ = fVar205 * auVar140._0_4_;
              auVar139._4_4_ = fVar206 * auVar140._4_4_;
              auVar139._8_4_ = fVar219 * auVar140._8_4_;
              auVar139._12_4_ = fVar230 * auVar140._12_4_;
              auVar167._0_4_ = fVar205 * auVar64._0_4_;
              auVar167._4_4_ = fVar206 * auVar64._4_4_;
              auVar167._8_4_ = fVar219 * auVar64._8_4_;
              auVar167._12_4_ = fVar230 * auVar64._12_4_;
              auVar78._0_4_ = fVar190 * auVar140._0_4_;
              auVar78._4_4_ = fVar154 * auVar140._4_4_;
              auVar78._8_4_ = fVar191 * auVar140._8_4_;
              auVar78._12_4_ = fVar204 * auVar140._12_4_;
              auVar107._0_4_ = fVar190 * auVar64._0_4_;
              auVar107._4_4_ = fVar154 * auVar64._4_4_;
              auVar107._8_4_ = fVar191 * auVar64._8_4_;
              auVar107._12_4_ = fVar204 * auVar64._12_4_;
              auVar140 = vminps_avx(auVar139,auVar167);
              auVar64 = vminps_avx(auVar78,auVar107);
              auVar140 = vminps_avx(auVar140,auVar64);
              auVar64 = vmaxps_avx(auVar167,auVar139);
              auVar97 = vmaxps_avx(auVar107,auVar78);
              auVar140 = vhaddps_avx(auVar140,auVar140);
              auVar64 = vmaxps_avx(auVar97,auVar64);
              auVar64 = vhaddps_avx(auVar64,auVar64);
              auVar97 = vmovshdup_avx(auVar117);
              auVar126 = ZEXT416((uint)(auVar97._0_4_ + auVar140._0_4_));
              auVar140 = vmaxss_avx(auVar201,auVar126);
              auVar97 = ZEXT416((uint)(auVar97._0_4_ + auVar64._0_4_));
              auVar64 = vminss_avx(auVar97,auVar116);
              if (auVar140._0_4_ <= auVar64._0_4_) {
                uVar59 = 0;
                if ((fVar152 < fVar189) && (fVar153 < fVar143)) {
                  auVar140 = vcmpps_avx(auVar97,auVar116,1);
                  auVar64 = vcmpps_avx(auVar201,auVar126,1);
                  auVar140 = vandps_avx(auVar64,auVar140);
                  uVar59 = auVar140._0_4_;
                }
                auVar265 = ZEXT1664(auVar201);
                if ((uVar60 < 4 && 0.001 <= fVar188) && (uVar59 & 1) == 0) goto LAB_00e6725e;
                lVar57 = 200;
                do {
                  fVar188 = auVar117._0_4_;
                  fVar143 = 1.0 - fVar188;
                  auVar140 = ZEXT416((uint)(fVar143 * fVar143 * fVar143));
                  auVar140 = vshufps_avx(auVar140,auVar140,0);
                  auVar64 = ZEXT416((uint)(fVar188 * 3.0 * fVar143 * fVar143));
                  auVar64 = vshufps_avx(auVar64,auVar64,0);
                  auVar97 = ZEXT416((uint)(fVar143 * fVar188 * fVar188 * 3.0));
                  auVar97 = vshufps_avx(auVar97,auVar97,0);
                  auVar126 = ZEXT416((uint)(fVar188 * fVar188 * fVar188));
                  auVar126 = vshufps_avx(auVar126,auVar126,0);
                  fVar143 = auVar140._0_4_ * local_558 +
                            auVar64._0_4_ * (float)local_5e8._0_4_ +
                            auVar126._0_4_ * (float)local_258._0_4_ +
                            auVar97._0_4_ * (float)local_568._0_4_;
                  fVar188 = auVar140._4_4_ * fStack_554 +
                            auVar64._4_4_ * (float)local_5e8._4_4_ +
                            auVar126._4_4_ * (float)local_258._4_4_ +
                            auVar97._4_4_ * (float)local_568._4_4_;
                  auVar79._0_8_ = CONCAT44(fVar188,fVar143);
                  auVar79._8_4_ =
                       auVar140._8_4_ * fStack_550 +
                       auVar64._8_4_ * fStack_5e0 +
                       auVar126._8_4_ * fStack_250 + auVar97._8_4_ * fStack_560;
                  auVar79._12_4_ =
                       auVar140._12_4_ * fStack_54c +
                       auVar64._12_4_ * fStack_5dc +
                       auVar126._12_4_ * fStack_24c + auVar97._12_4_ * fStack_55c;
                  auVar108._8_8_ = auVar79._0_8_;
                  auVar108._0_8_ = auVar79._0_8_;
                  auVar64 = vshufpd_avx(auVar79,auVar79,1);
                  auVar140 = vmovshdup_avx(auVar117);
                  auVar64 = vsubps_avx(auVar64,auVar108);
                  auVar80._0_4_ = auVar140._0_4_ * auVar64._0_4_ + fVar143;
                  auVar80._4_4_ = auVar140._4_4_ * auVar64._4_4_ + fVar188;
                  auVar80._8_4_ = auVar140._8_4_ * auVar64._8_4_ + fVar143;
                  auVar80._12_4_ = auVar140._12_4_ * auVar64._12_4_ + fVar188;
                  auVar140 = vshufps_avx(auVar80,auVar80,0);
                  auVar64 = vshufps_avx(auVar80,auVar80,0x55);
                  auVar109._0_4_ = auVar70._0_4_ * auVar140._0_4_ + auVar111._0_4_ * auVar64._0_4_;
                  auVar109._4_4_ = auVar70._4_4_ * auVar140._4_4_ + auVar111._4_4_ * auVar64._4_4_;
                  auVar109._8_4_ = auVar70._8_4_ * auVar140._8_4_ + auVar111._8_4_ * auVar64._8_4_;
                  auVar109._12_4_ =
                       auVar70._12_4_ * auVar140._12_4_ + auVar111._12_4_ * auVar64._12_4_;
                  auVar117 = vsubps_avx(auVar117,auVar109);
                  auVar110._8_4_ = 0x7fffffff;
                  auVar110._0_8_ = 0x7fffffff7fffffff;
                  auVar110._12_4_ = 0x7fffffff;
                  auVar140 = vandps_avx(auVar80,auVar110);
                  auVar64 = vshufps_avx(auVar140,auVar140,0xf5);
                  auVar140 = vmaxss_avx(auVar64,auVar140);
                  if (auVar140._0_4_ < (float)local_268._0_4_) {
                    fVar143 = auVar117._0_4_;
                    if ((0.0 <= fVar143) && (fVar143 <= 1.0)) {
                      auVar70 = vmovshdup_avx(auVar117);
                      fVar188 = auVar70._0_4_;
                      if ((0.0 <= fVar188) && (fVar188 <= 1.0)) {
                        auVar70 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar91 = vinsertps_avx(auVar70,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar70 = vdpps_avx(auVar91,local_2a8,0x7f);
                        auVar111 = vdpps_avx(auVar91,local_2b8,0x7f);
                        auVar140 = vdpps_avx(auVar91,local_2c8,0x7f);
                        auVar64 = vdpps_avx(auVar91,local_2d8,0x7f);
                        auVar97 = vdpps_avx(auVar91,local_2e8,0x7f);
                        auVar126 = vdpps_avx(auVar91,local_2f8,0x7f);
                        auVar63 = vdpps_avx(auVar91,local_308,0x7f);
                        auVar91 = vdpps_avx(auVar91,local_318,0x7f);
                        fVar154 = 1.0 - fVar188;
                        fVar191 = 1.0 - fVar143;
                        fVar152 = auVar117._4_4_;
                        fVar189 = auVar117._8_4_;
                        fVar153 = auVar117._12_4_;
                        fVar190 = fVar191 * fVar143 * fVar143 * 3.0;
                        auVar217._0_4_ = fVar143 * fVar143 * fVar143;
                        auVar217._4_4_ = fVar152 * fVar152 * fVar152;
                        auVar217._8_4_ = fVar189 * fVar189 * fVar189;
                        auVar217._12_4_ = fVar153 * fVar153 * fVar153;
                        fVar189 = fVar191 * fVar191 * fVar143 * 3.0;
                        fVar153 = fVar191 * fVar191 * fVar191;
                        fVar152 = fVar153 * (fVar154 * auVar70._0_4_ + fVar188 * auVar97._0_4_) +
                                  (fVar154 * auVar111._0_4_ + auVar126._0_4_ * fVar188) * fVar189 +
                                  fVar190 * (auVar63._0_4_ * fVar188 + fVar154 * auVar140._0_4_) +
                                  auVar217._0_4_ *
                                  (fVar154 * auVar64._0_4_ + fVar188 * auVar91._0_4_);
                        auVar70 = ZEXT416((uint)fVar152);
                        if (((fVar172 <= fVar152) &&
                            (fVar154 = *(float *)(ray + k * 4 + 0x80), fVar152 <= fVar154)) &&
                           (pGVar7 = (context->scene->geometries).items[uVar55].ptr,
                           (pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1a8 = vshufps_avx(auVar117,auVar117,0x55);
                          auVar238._8_4_ = 0x3f800000;
                          auVar238._0_8_ = 0x3f8000003f800000;
                          auVar238._12_4_ = 0x3f800000;
                          auVar111 = vsubps_avx(auVar238,local_1a8);
                          fVar204 = local_1a8._0_4_;
                          fVar205 = local_1a8._4_4_;
                          fVar206 = local_1a8._8_4_;
                          fVar219 = local_1a8._12_4_;
                          fVar230 = auVar111._0_4_;
                          fVar246 = auVar111._4_4_;
                          fVar255 = auVar111._8_4_;
                          fVar257 = auVar111._12_4_;
                          auVar252._0_4_ =
                               fVar204 * (float)local_3f8._0_4_ + fVar230 * (float)local_3e8._0_4_;
                          auVar252._4_4_ =
                               fVar205 * (float)local_3f8._4_4_ + fVar246 * (float)local_3e8._4_4_;
                          auVar252._8_4_ = fVar206 * fStack_3f0 + fVar255 * fStack_3e0;
                          auVar252._12_4_ = fVar219 * fStack_3ec + fVar257 * fStack_3dc;
                          auVar263._0_4_ =
                               fVar204 * (float)local_438._0_4_ + fVar230 * (float)local_418._0_4_;
                          auVar263._4_4_ =
                               fVar205 * (float)local_438._4_4_ + fVar246 * (float)local_418._4_4_;
                          auVar263._8_4_ = fVar206 * fStack_430 + fVar255 * fStack_410;
                          auVar263._12_4_ = fVar219 * fStack_42c + fVar257 * fStack_40c;
                          auVar272._0_4_ =
                               fVar204 * (float)local_338._0_4_ + fVar230 * (float)local_428._0_4_;
                          auVar272._4_4_ =
                               fVar205 * (float)local_338._4_4_ + fVar246 * (float)local_428._4_4_;
                          auVar272._8_4_ = fVar206 * fStack_330 + fVar255 * fStack_420;
                          auVar272._12_4_ = fVar219 * fStack_32c + fVar257 * fStack_41c;
                          auVar239._0_4_ = fVar204 * fVar229 + fVar230 * (float)local_408._0_4_;
                          auVar239._4_4_ = fVar205 * fVar231 + fVar246 * (float)local_408._4_4_;
                          auVar239._8_4_ = fVar206 * fVar254 + fVar255 * fStack_400;
                          auVar239._12_4_ = fVar219 * fVar256 + fVar257 * fStack_3fc;
                          auVar97 = vsubps_avx(auVar263,auVar252);
                          auVar126 = vsubps_avx(auVar272,auVar263);
                          auVar63 = vsubps_avx(auVar239,auVar272);
                          local_1b8 = vshufps_avx(auVar117,auVar117,0);
                          fVar219 = local_1b8._0_4_;
                          fVar230 = local_1b8._4_4_;
                          fVar246 = local_1b8._8_4_;
                          fVar255 = local_1b8._12_4_;
                          auVar111 = vshufps_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),0);
                          fVar191 = auVar111._0_4_;
                          fVar204 = auVar111._4_4_;
                          fVar205 = auVar111._8_4_;
                          fVar206 = auVar111._12_4_;
                          auVar111 = vshufps_avx(auVar217,auVar217,0);
                          auVar140 = vshufps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),0);
                          auVar64 = vshufps_avx(ZEXT416((uint)fVar189),ZEXT416((uint)fVar189),0);
                          auVar202._0_4_ =
                               (fVar191 * (fVar191 * auVar97._0_4_ + fVar219 * auVar126._0_4_) +
                               fVar219 * (fVar191 * auVar126._0_4_ + fVar219 * auVar63._0_4_)) * 3.0
                          ;
                          auVar202._4_4_ =
                               (fVar204 * (fVar204 * auVar97._4_4_ + fVar230 * auVar126._4_4_) +
                               fVar230 * (fVar204 * auVar126._4_4_ + fVar230 * auVar63._4_4_)) * 3.0
                          ;
                          auVar202._8_4_ =
                               (fVar205 * (fVar205 * auVar97._8_4_ + fVar246 * auVar126._8_4_) +
                               fVar246 * (fVar205 * auVar126._8_4_ + fVar246 * auVar63._8_4_)) * 3.0
                          ;
                          auVar202._12_4_ =
                               (fVar206 * (fVar206 * auVar97._12_4_ + fVar255 * auVar126._12_4_) +
                               fVar255 * (fVar206 * auVar126._12_4_ + fVar255 * auVar63._12_4_)) *
                               3.0;
                          auVar97 = vshufps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),0);
                          auVar168._0_4_ =
                               auVar97._0_4_ * (float)local_348._0_4_ +
                               auVar64._0_4_ * (float)local_358._0_4_ +
                               auVar111._0_4_ * (float)local_378._0_4_ +
                               auVar140._0_4_ * (float)local_368._0_4_;
                          auVar168._4_4_ =
                               auVar97._4_4_ * (float)local_348._4_4_ +
                               auVar64._4_4_ * (float)local_358._4_4_ +
                               auVar111._4_4_ * (float)local_378._4_4_ +
                               auVar140._4_4_ * (float)local_368._4_4_;
                          auVar168._8_4_ =
                               auVar97._8_4_ * fStack_340 +
                               auVar64._8_4_ * fStack_350 +
                               auVar111._8_4_ * fStack_370 + auVar140._8_4_ * fStack_360;
                          auVar168._12_4_ =
                               auVar97._12_4_ * fStack_33c +
                               auVar64._12_4_ * fStack_34c +
                               auVar111._12_4_ * fStack_36c + auVar140._12_4_ * fStack_35c;
                          auVar111 = vshufps_avx(auVar202,auVar202,0xc9);
                          auVar185._0_4_ = auVar168._0_4_ * auVar111._0_4_;
                          auVar185._4_4_ = auVar168._4_4_ * auVar111._4_4_;
                          auVar185._8_4_ = auVar168._8_4_ * auVar111._8_4_;
                          auVar185._12_4_ = auVar168._12_4_ * auVar111._12_4_;
                          auVar111 = vshufps_avx(auVar168,auVar168,0xc9);
                          auVar169._0_4_ = auVar202._0_4_ * auVar111._0_4_;
                          auVar169._4_4_ = auVar202._4_4_ * auVar111._4_4_;
                          auVar169._8_4_ = auVar202._8_4_ * auVar111._8_4_;
                          auVar169._12_4_ = auVar202._12_4_ * auVar111._12_4_;
                          auVar111 = vsubps_avx(auVar169,auVar185);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar152;
                            uVar4 = vextractps_avx(auVar111,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                            uVar4 = vextractps_avx(auVar111,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                            *(int *)(ray + k * 4 + 0xe0) = auVar111._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar143;
                            *(float *)(ray + k * 4 + 0x100) = fVar188;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_478;
                            *(uint *)(ray + k * 4 + 0x120) = uVar55;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar140 = vshufps_avx(auVar111,auVar111,0x55);
                            auVar64 = vshufps_avx(auVar111,auVar111,0xaa);
                            local_1c8 = vshufps_avx(auVar111,auVar111,0);
                            local_1e8[0] = (RTCHitN)auVar140[0];
                            local_1e8[1] = (RTCHitN)auVar140[1];
                            local_1e8[2] = (RTCHitN)auVar140[2];
                            local_1e8[3] = (RTCHitN)auVar140[3];
                            local_1e8[4] = (RTCHitN)auVar140[4];
                            local_1e8[5] = (RTCHitN)auVar140[5];
                            local_1e8[6] = (RTCHitN)auVar140[6];
                            local_1e8[7] = (RTCHitN)auVar140[7];
                            local_1e8[8] = (RTCHitN)auVar140[8];
                            local_1e8[9] = (RTCHitN)auVar140[9];
                            local_1e8[10] = (RTCHitN)auVar140[10];
                            local_1e8[0xb] = (RTCHitN)auVar140[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar140[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar140[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar140[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar140[0xf];
                            local_1d8 = auVar64;
                            local_198 = local_3a8._0_8_;
                            uStack_190 = local_3a8._8_8_;
                            local_188 = local_398._0_8_;
                            uStack_180 = local_398._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar152;
                            local_498 = *local_480;
                            local_468.valid = (int *)local_498;
                            local_468.geometryUserPtr = pGVar7->userPtr;
                            local_468.context = context->user;
                            local_468.hit = local_1e8;
                            local_468.N = 4;
                            local_468.ray = (RTCRayN *)ray;
                            if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar7->intersectionFilterN)(&local_468);
                              auVar265._8_56_ = extraout_var;
                              auVar265._0_8_ = extraout_XMM1_Qa;
                              auVar70 = auVar265._0_16_;
                            }
                            if (local_498 == (undefined1  [16])0x0) {
                              auVar111 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar70 = vpcmpeqd_avx(auVar70,auVar70);
                              auVar111 = auVar111 ^ auVar70;
                            }
                            else {
                              p_Var10 = context->args->filter;
                              auVar70 = vpcmpeqd_avx(auVar64,auVar64);
                              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var10)(&local_468);
                                auVar70 = vpcmpeqd_avx(auVar70,auVar70);
                              }
                              auVar140 = vpcmpeqd_avx(local_498,_DAT_01f7aa10);
                              auVar111 = auVar140 ^ auVar70;
                              if (local_498 != (undefined1  [16])0x0) {
                                auVar140 = auVar140 ^ auVar70;
                                auVar70 = vmaskmovps_avx(auVar140,*(undefined1 (*) [16])
                                                                   local_468.hit);
                                *(undefined1 (*) [16])(local_468.ray + 0xc0) = auVar70;
                                auVar70 = vmaskmovps_avx(auVar140,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x10));
                                *(undefined1 (*) [16])(local_468.ray + 0xd0) = auVar70;
                                auVar70 = vmaskmovps_avx(auVar140,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x20));
                                *(undefined1 (*) [16])(local_468.ray + 0xe0) = auVar70;
                                auVar70 = vmaskmovps_avx(auVar140,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x30));
                                *(undefined1 (*) [16])(local_468.ray + 0xf0) = auVar70;
                                auVar70 = vmaskmovps_avx(auVar140,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x40));
                                *(undefined1 (*) [16])(local_468.ray + 0x100) = auVar70;
                                auVar70 = vmaskmovps_avx(auVar140,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x50));
                                *(undefined1 (*) [16])(local_468.ray + 0x110) = auVar70;
                                auVar70 = vmaskmovps_avx(auVar140,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x60));
                                *(undefined1 (*) [16])(local_468.ray + 0x120) = auVar70;
                                auVar70 = vmaskmovps_avx(auVar140,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x70));
                                *(undefined1 (*) [16])(local_468.ray + 0x130) = auVar70;
                                auVar70 = vmaskmovps_avx(auVar140,*(undefined1 (*) [16])
                                                                   (local_468.hit + 0x80));
                                *(undefined1 (*) [16])(local_468.ray + 0x140) = auVar70;
                              }
                            }
                            auVar81._8_8_ = 0x100000001;
                            auVar81._0_8_ = 0x100000001;
                            if ((auVar81 & auVar111) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar154;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar57 = lVar57 + -1;
                } while (lVar57 != 0);
              }
            }
          }
        }
        if (uVar60 == 0) break;
      } while( true );
    }
    uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar82._4_4_ = uVar4;
    auVar82._0_4_ = uVar4;
    auVar82._8_4_ = uVar4;
    auVar82._12_4_ = uVar4;
    auVar70 = vcmpps_avx(local_388,auVar82,2);
    uVar55 = vmovmskps_avx(auVar70);
    uVar54 = uVar54 & (uint)local_470 & uVar55;
    if (uVar54 == 0) {
      return;
    }
  } while( true );
LAB_00e6725e:
  auVar70 = vinsertps_avx(ZEXT416((uint)fVar152),ZEXT416((uint)fVar143),0x10);
  auVar273 = ZEXT1664(auVar70);
  goto LAB_00e65b1a;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }